

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm_x86_avx.cpp
# Opt level: O1

int ncnn::lstm(Mat *bottom_blob,Mat *top_blob,int reverse,Mat *weight_xc,Mat *bias_c,Mat *weight_hc,
              Mat *hidden_state,Mat *cell_state,Option *opt)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  float *pfVar4;
  long lVar5;
  long lVar6;
  float *pfVar7;
  uint uVar8;
  uint uVar9;
  uint _w;
  undefined4 uVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  int *piVar25;
  uint uVar26;
  int iVar27;
  long lVar28;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  uint uVar34;
  long lVar35;
  void *pvVar36;
  void *pvVar37;
  int iVar38;
  int iVar39;
  void *pvVar40;
  _func_int ***ppp_Var41;
  long lVar42;
  void *pvVar43;
  void *pvVar44;
  void *pvVar45;
  ulong uVar46;
  void *pvVar47;
  ulong uVar48;
  void *pvVar49;
  void *pvVar50;
  void *pvVar51;
  int iVar52;
  void *pvVar53;
  void *pvVar54;
  Allocator *pAVar55;
  ulong uVar56;
  void *pvVar57;
  int iVar58;
  void *pvVar59;
  void *pvVar60;
  void *pvVar61;
  long lVar62;
  long lVar63;
  long lVar64;
  void *pvVar65;
  void *pvVar66;
  void *pvVar67;
  void *pvVar68;
  void *pvVar69;
  void *pvVar70;
  void *pvVar71;
  void *pvVar72;
  long lVar73;
  long lVar74;
  void *pvVar75;
  void *pvVar76;
  float fVar77;
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  undefined1 auVar84 [64];
  undefined1 auVar91 [16];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [64];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar110 [64];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 in_ZMM3 [64];
  undefined1 auVar121 [64];
  undefined1 auVar123 [16];
  float fVar122;
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  undefined1 auVar127 [64];
  float fVar132;
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  undefined1 in_ZMM5 [64];
  undefined1 auVar136 [64];
  undefined1 auVar143 [32];
  undefined1 in_ZMM6 [64];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [64];
  undefined1 auVar147 [16];
  undefined1 in_ZMM9 [64];
  float fVar149;
  undefined1 auVar148 [32];
  undefined1 in_ZMM10 [64];
  float *bias_c_G;
  float *gates_data_F;
  float *bias_c_O;
  float *bias_c_F;
  float *bias_c_I;
  float *gates_data_G;
  float *gates_data_O;
  float *gates_data_I;
  void *local_320;
  void *local_318;
  void *local_308;
  void *local_298;
  void *local_238;
  void *local_1a0;
  void *local_198;
  void *local_190;
  void *local_188;
  void *local_180;
  void *local_178;
  void *local_170;
  void *local_168;
  Mat local_78;
  long lVar29;
  undefined1 auVar109 [32];
  undefined1 auVar115 [32];
  undefined1 auVar118 [32];
  undefined1 auVar126 [32];
  
  uVar8 = bottom_blob->w;
  uVar9 = bottom_blob->h;
  _w = top_blob->w;
  local_78.cstep = 0;
  local_78.data = (Allocator *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize = SUB168(ZEXT816(0) << 0x40,4);
  local_78.elempack = 0;
  local_78.allocator = (Allocator *)local_78.data;
  local_78.dims = (int)local_78.refcount;
  local_78.w = local_78.refcount._4_4_;
  local_78._48_8_ = local_78.elemsize;
  local_78.c = local_78.elempack;
  Mat::create(&local_78,_w,4,4,opt->workspace_allocator);
  iVar38 = -100;
  if (((Allocator *)local_78.data != (Allocator *)0x0) && ((long)local_78.c * local_78.cstep != 0))
  {
    if (0 < (int)uVar9) {
      uVar56 = (ulong)(int)_w;
      uVar48 = uVar56 & 0xfffffffffffffffe;
      iVar52 = (int)uVar8 >> 3;
      iVar58 = (int)_w >> 3;
      lVar28 = (long)(int)(_w * 2);
      lVar35 = (long)(int)(_w * 3);
      iVar38 = (uVar8 & 7) + 1;
      iVar39 = (_w & 7) + 1;
      uVar34 = 0;
      do {
        uVar26 = ~uVar34 + uVar9;
        if (reverse == 0) {
          uVar26 = uVar34;
        }
        lVar29 = (long)(int)uVar26;
        if (0 < (int)_w >> 1) {
          pvVar45 = (void *)(bottom_blob->w * lVar29 * bottom_blob->elemsize +
                            (long)bottom_blob->data);
          pvVar68 = bias_c->data;
          lVar30 = (long)bias_c->w * bias_c->elemsize;
          lVar31 = (long)local_78.w * local_78.elemsize;
          pvVar51 = weight_xc->data;
          lVar62 = (long)weight_xc->w * weight_xc->elemsize;
          lVar42 = (long)weight_hc->w * weight_hc->elemsize;
          pvVar53 = (void *)(lVar62 * uVar56 + (long)pvVar51);
          pvVar66 = (void *)(lVar62 * lVar28 + (long)pvVar51);
          pvVar69 = (void *)(lVar62 * lVar35 + (long)pvVar51);
          pvVar71 = (void *)(lVar62 * (uVar56 + 1) + (long)pvVar51);
          pvVar49 = (void *)(lVar62 * (lVar28 + 1) + (long)pvVar51);
          local_168 = (void *)(lVar62 * (lVar35 + 1) + (long)pvVar51);
          pvVar44 = weight_hc->data;
          local_170 = (void *)(lVar42 * uVar56 + (long)pvVar44);
          local_178 = (void *)(lVar42 * lVar28 + (long)pvVar44);
          pvVar59 = (void *)(lVar42 * lVar35 + (long)pvVar44);
          pvVar72 = (void *)(lVar42 * (uVar56 + 1) + (long)pvVar44);
          pvVar70 = (void *)(lVar42 * (lVar28 + 1) + (long)pvVar44);
          pvVar36 = (void *)(lVar42 * (lVar35 + 1) + (long)pvVar44);
          pvVar47 = hidden_state->data;
          lVar32 = lVar62 * 2;
          pvVar61 = (void *)((long)pvVar51 + lVar62);
          lVar33 = lVar42 * 2;
          pvVar57 = (void *)((long)pvVar44 + lVar42);
          uVar46 = 0;
          pvVar37 = pvVar44;
          pvVar54 = pvVar51;
          do {
            lVar74 = uVar56 + uVar46 * 2;
            lVar1 = lVar28 + uVar46 * 2;
            lVar2 = lVar35 + uVar46 * 2;
            lVar5 = uVar46 * 2 + 1;
            lVar6 = uVar56 + 1 + uVar46 * 2;
            lVar63 = lVar28 + uVar46 * 2 + 1;
            lVar73 = lVar35 + uVar46 * 2 + 1;
            if (iVar52 < 1) {
              local_180 = (void *)(lVar62 * uVar46 * 2 + (long)pvVar51);
              local_188 = (void *)(lVar62 * lVar74 + (long)pvVar51);
              local_190 = (void *)(lVar62 * lVar1 + (long)pvVar51);
              pvVar60 = (void *)(lVar62 * lVar2 + (long)pvVar51);
              local_198 = (void *)(lVar62 * lVar5 + (long)pvVar51);
              local_1a0 = (void *)(lVar62 * lVar6 + (long)pvVar51);
              pvVar40 = (void *)(lVar62 * lVar63 + (long)pvVar51);
              pvVar65 = (void *)(lVar62 * lVar73 + (long)pvVar51);
              auVar84 = ZEXT864(0);
              auVar99 = ZEXT864(0);
              auVar121 = ZEXT864(0);
              auVar127 = ZEXT864(0);
              auVar136 = ZEXT864(0);
              in_ZMM6 = ZEXT864(0);
              auVar146 = ZEXT864(0);
              auVar110 = ZEXT864(0);
              pvVar76 = pvVar45;
            }
            else {
              auVar110 = ZEXT864(0);
              lVar64 = 0;
              auVar146 = ZEXT864(0);
              in_ZMM6 = ZEXT864(0);
              auVar136 = ZEXT864(0);
              auVar127 = ZEXT864(0);
              auVar121 = ZEXT864(0);
              auVar99 = ZEXT864(0);
              auVar84 = ZEXT864(0);
              iVar27 = iVar52 + 1;
              do {
                pfVar7 = (float *)((long)pvVar45 + lVar64);
                fVar122 = *pfVar7;
                fVar132 = pfVar7[1];
                fVar128 = pfVar7[2];
                fVar137 = pfVar7[3];
                fVar129 = pfVar7[4];
                fVar138 = pfVar7[5];
                fVar130 = pfVar7[6];
                pfVar3 = (float *)((long)pvVar54 + lVar64);
                fVar131 = in_ZMM9._28_4_;
                auVar84 = ZEXT3264(CONCAT428(fVar131 + auVar84._28_4_,
                                             CONCAT424(fVar130 * pfVar3[6] + auVar84._24_4_,
                                                       CONCAT420(fVar138 * pfVar3[5] +
                                                                 auVar84._20_4_,
                                                                 CONCAT416(fVar129 * pfVar3[4] +
                                                                           auVar84._16_4_,
                                                                           CONCAT412(fVar137 * 
                                                  pfVar3[3] + auVar84._12_4_,
                                                  CONCAT48(fVar128 * pfVar3[2] + auVar84._8_4_,
                                                           CONCAT44(fVar132 * pfVar3[1] +
                                                                    auVar84._4_4_,
                                                                    fVar122 * *pfVar3 +
                                                                    auVar84._0_4_))))))));
                pfVar3 = (float *)((long)pvVar53 + lVar64);
                pfVar4 = (float *)((long)pvVar66 + lVar64);
                auVar99 = ZEXT3264(CONCAT428(fVar131 + auVar99._28_4_,
                                             CONCAT424(fVar130 * pfVar3[6] + auVar99._24_4_,
                                                       CONCAT420(fVar138 * pfVar3[5] +
                                                                 auVar99._20_4_,
                                                                 CONCAT416(fVar129 * pfVar3[4] +
                                                                           auVar99._16_4_,
                                                                           CONCAT412(fVar137 * 
                                                  pfVar3[3] + auVar99._12_4_,
                                                  CONCAT48(fVar128 * pfVar3[2] + auVar99._8_4_,
                                                           CONCAT44(fVar132 * pfVar3[1] +
                                                                    auVar99._4_4_,
                                                                    fVar122 * *pfVar3 +
                                                                    auVar99._0_4_))))))));
                fVar149 = in_ZMM10._28_4_;
                auVar121 = ZEXT3264(CONCAT428(fVar149 + auVar121._28_4_,
                                              CONCAT424(fVar130 * pfVar4[6] + auVar121._24_4_,
                                                        CONCAT420(fVar138 * pfVar4[5] +
                                                                  auVar121._20_4_,
                                                                  CONCAT416(fVar129 * pfVar4[4] +
                                                                            auVar121._16_4_,
                                                                            CONCAT412(fVar137 * 
                                                  pfVar4[3] + auVar121._12_4_,
                                                  CONCAT48(fVar128 * pfVar4[2] + auVar121._8_4_,
                                                           CONCAT44(fVar132 * pfVar4[1] +
                                                                    auVar121._4_4_,
                                                                    fVar122 * *pfVar4 +
                                                                    auVar121._0_4_))))))));
                pfVar3 = (float *)((long)pvVar69 + lVar64);
                auVar127 = ZEXT3264(CONCAT428(fVar131 + auVar127._28_4_,
                                              CONCAT424(fVar130 * pfVar3[6] + auVar127._24_4_,
                                                        CONCAT420(fVar138 * pfVar3[5] +
                                                                  auVar127._20_4_,
                                                                  CONCAT416(fVar129 * pfVar3[4] +
                                                                            auVar127._16_4_,
                                                                            CONCAT412(fVar137 * 
                                                  pfVar3[3] + auVar127._12_4_,
                                                  CONCAT48(fVar128 * pfVar3[2] + auVar127._8_4_,
                                                           CONCAT44(fVar132 * pfVar3[1] +
                                                                    auVar127._4_4_,
                                                                    fVar122 * *pfVar3 +
                                                                    auVar127._0_4_))))))));
                pfVar3 = (float *)((long)pvVar61 + lVar64);
                auVar136 = ZEXT3264(CONCAT428(fVar131 + auVar136._28_4_,
                                              CONCAT424(fVar130 * pfVar3[6] + auVar136._24_4_,
                                                        CONCAT420(fVar138 * pfVar3[5] +
                                                                  auVar136._20_4_,
                                                                  CONCAT416(fVar129 * pfVar3[4] +
                                                                            auVar136._16_4_,
                                                                            CONCAT412(fVar137 * 
                                                  pfVar3[3] + auVar136._12_4_,
                                                  CONCAT48(fVar128 * pfVar3[2] + auVar136._8_4_,
                                                           CONCAT44(fVar132 * pfVar3[1] +
                                                                    auVar136._4_4_,
                                                                    fVar122 * *pfVar3 +
                                                                    auVar136._0_4_))))))));
                pfVar3 = (float *)((long)pvVar71 + lVar64);
                in_ZMM9 = ZEXT3264(CONCAT428(fVar131,CONCAT424(fVar130 * pfVar3[6],
                                                               CONCAT420(fVar138 * pfVar3[5],
                                                                         CONCAT416(fVar129 * pfVar3[
                                                  4],CONCAT412(fVar137 * pfVar3[3],
                                                               CONCAT48(fVar128 * pfVar3[2],
                                                                        CONCAT44(fVar132 * pfVar3[1]
                                                                                 ,fVar122 * *pfVar3)
                                                                       )))))));
                pfVar4 = (float *)((long)pvVar49 + lVar64);
                in_ZMM10 = ZEXT3264(CONCAT428(fVar149,CONCAT424(fVar130 * pfVar4[6],
                                                                CONCAT420(fVar138 * pfVar4[5],
                                                                          CONCAT416(fVar129 * pfVar4
                                                  [4],CONCAT412(fVar137 * pfVar4[3],
                                                                CONCAT48(fVar128 * pfVar4[2],
                                                                         CONCAT44(fVar132 * pfVar4[1
                                                  ],fVar122 * *pfVar4))))))));
                in_ZMM6 = ZEXT3264(CONCAT428(fVar131 + in_ZMM6._28_4_,
                                             CONCAT424(fVar130 * pfVar3[6] + in_ZMM6._24_4_,
                                                       CONCAT420(fVar138 * pfVar3[5] +
                                                                 in_ZMM6._20_4_,
                                                                 CONCAT416(fVar129 * pfVar3[4] +
                                                                           in_ZMM6._16_4_,
                                                                           CONCAT412(fVar137 * 
                                                  pfVar3[3] + in_ZMM6._12_4_,
                                                  CONCAT48(fVar128 * pfVar3[2] + in_ZMM6._8_4_,
                                                           CONCAT44(fVar132 * pfVar3[1] +
                                                                    in_ZMM6._4_4_,
                                                                    fVar122 * *pfVar3 +
                                                                    in_ZMM6._0_4_))))))));
                auVar146 = ZEXT3264(CONCAT428(fVar149 + auVar146._28_4_,
                                              CONCAT424(fVar130 * pfVar4[6] + auVar146._24_4_,
                                                        CONCAT420(fVar138 * pfVar4[5] +
                                                                  auVar146._20_4_,
                                                                  CONCAT416(fVar129 * pfVar4[4] +
                                                                            auVar146._16_4_,
                                                                            CONCAT412(fVar137 * 
                                                  pfVar4[3] + auVar146._12_4_,
                                                  CONCAT48(fVar128 * pfVar4[2] + auVar146._8_4_,
                                                           CONCAT44(fVar132 * pfVar4[1] +
                                                                    auVar146._4_4_,
                                                                    fVar122 * *pfVar4 +
                                                                    auVar146._0_4_))))))));
                pfVar3 = (float *)((long)local_168 + lVar64);
                auVar110 = ZEXT3264(CONCAT428(pfVar7[7] + auVar110._28_4_,
                                              CONCAT424(fVar130 * pfVar3[6] + auVar110._24_4_,
                                                        CONCAT420(fVar138 * pfVar3[5] +
                                                                  auVar110._20_4_,
                                                                  CONCAT416(fVar129 * pfVar3[4] +
                                                                            auVar110._16_4_,
                                                                            CONCAT412(fVar137 * 
                                                  pfVar3[3] + auVar110._12_4_,
                                                  CONCAT48(fVar128 * pfVar3[2] + auVar110._8_4_,
                                                           CONCAT44(fVar132 * pfVar3[1] +
                                                                    auVar110._4_4_,
                                                                    fVar122 * *pfVar3 +
                                                                    auVar110._0_4_))))))));
                lVar64 = lVar64 + 0x20;
                iVar27 = iVar27 + -1;
              } while (1 < iVar27);
              local_180 = (void *)((long)pvVar54 + lVar64);
              local_188 = (void *)((long)pvVar53 + lVar64);
              local_190 = (void *)((long)pvVar66 + lVar64);
              pvVar60 = (void *)((long)pvVar69 + lVar64);
              local_198 = (void *)((long)pvVar61 + lVar64);
              local_1a0 = (void *)((long)pvVar71 + lVar64);
              pvVar40 = (void *)((long)pvVar49 + lVar64);
              pvVar65 = (void *)(lVar64 + (long)local_168);
              pvVar76 = (void *)((long)pvVar45 + lVar64);
            }
            auVar124 = auVar127._0_32_;
            auVar145 = auVar146._0_32_;
            auVar92 = auVar99._0_32_;
            auVar78 = auVar84._0_32_;
            auVar113 = auVar121._0_32_;
            auVar133 = auVar136._0_32_;
            auVar102 = auVar110._0_32_;
            if (iVar58 < 1) {
              pvVar43 = (void *)(lVar42 * uVar46 * 2 + (long)pvVar44);
              local_320 = (void *)(lVar74 * lVar42 + (long)pvVar44);
              local_298 = (void *)(lVar1 * lVar42 + (long)pvVar44);
              local_238 = (void *)(lVar2 * lVar42 + (long)pvVar44);
              pvVar67 = (void *)(lVar42 * lVar5 + (long)pvVar44);
              local_318 = (void *)(lVar6 * lVar42 + (long)pvVar44);
              local_308 = (void *)(lVar63 * lVar42 + (long)pvVar44);
              pvVar75 = (void *)(lVar73 * lVar42 + (long)pvVar44);
              pvVar50 = pvVar47;
            }
            else {
              lVar74 = 0;
              iVar27 = iVar58 + 1;
              do {
                pfVar3 = (float *)((long)pvVar47 + lVar74);
                fVar122 = *pfVar3;
                fVar132 = pfVar3[1];
                fVar128 = pfVar3[2];
                fVar137 = pfVar3[3];
                fVar129 = pfVar3[4];
                fVar138 = pfVar3[5];
                fVar130 = pfVar3[6];
                pfVar4 = (float *)((long)pvVar37 + lVar74);
                auVar78._0_4_ = fVar122 * *pfVar4 + auVar84._0_4_;
                auVar78._4_4_ = fVar132 * pfVar4[1] + auVar84._4_4_;
                auVar78._8_4_ = fVar128 * pfVar4[2] + auVar84._8_4_;
                auVar78._12_4_ = fVar137 * pfVar4[3] + auVar84._12_4_;
                auVar78._16_4_ = fVar129 * pfVar4[4] + auVar84._16_4_;
                auVar78._20_4_ = fVar138 * pfVar4[5] + auVar84._20_4_;
                auVar78._24_4_ = fVar130 * pfVar4[6] + auVar84._24_4_;
                fVar131 = in_ZMM9._28_4_;
                auVar78._28_4_ = fVar131 + auVar84._28_4_;
                auVar84 = ZEXT3264(auVar78);
                pfVar4 = (float *)((long)local_170 + lVar74);
                pfVar7 = (float *)((long)local_178 + lVar74);
                auVar92._0_4_ = fVar122 * *pfVar4 + auVar99._0_4_;
                auVar92._4_4_ = fVar132 * pfVar4[1] + auVar99._4_4_;
                auVar92._8_4_ = fVar128 * pfVar4[2] + auVar99._8_4_;
                auVar92._12_4_ = fVar137 * pfVar4[3] + auVar99._12_4_;
                auVar92._16_4_ = fVar129 * pfVar4[4] + auVar99._16_4_;
                auVar92._20_4_ = fVar138 * pfVar4[5] + auVar99._20_4_;
                auVar92._24_4_ = fVar130 * pfVar4[6] + auVar99._24_4_;
                auVar92._28_4_ = fVar131 + auVar99._28_4_;
                auVar99 = ZEXT3264(auVar92);
                auVar113._0_4_ = fVar122 * *pfVar7 + auVar121._0_4_;
                auVar113._4_4_ = fVar132 * pfVar7[1] + auVar121._4_4_;
                auVar113._8_4_ = fVar128 * pfVar7[2] + auVar121._8_4_;
                auVar113._12_4_ = fVar137 * pfVar7[3] + auVar121._12_4_;
                auVar113._16_4_ = fVar129 * pfVar7[4] + auVar121._16_4_;
                auVar113._20_4_ = fVar138 * pfVar7[5] + auVar121._20_4_;
                auVar113._24_4_ = fVar130 * pfVar7[6] + auVar121._24_4_;
                fVar149 = in_ZMM10._28_4_;
                auVar113._28_4_ = fVar149 + auVar121._28_4_;
                auVar121 = ZEXT3264(auVar113);
                pfVar4 = (float *)((long)pvVar59 + lVar74);
                auVar124._0_4_ = fVar122 * *pfVar4 + auVar127._0_4_;
                auVar124._4_4_ = fVar132 * pfVar4[1] + auVar127._4_4_;
                auVar124._8_4_ = fVar128 * pfVar4[2] + auVar127._8_4_;
                auVar124._12_4_ = fVar137 * pfVar4[3] + auVar127._12_4_;
                auVar124._16_4_ = fVar129 * pfVar4[4] + auVar127._16_4_;
                auVar124._20_4_ = fVar138 * pfVar4[5] + auVar127._20_4_;
                auVar124._24_4_ = fVar130 * pfVar4[6] + auVar127._24_4_;
                auVar124._28_4_ = fVar131 + auVar127._28_4_;
                auVar127 = ZEXT3264(auVar124);
                pfVar4 = (float *)((long)pvVar57 + lVar74);
                auVar133._0_4_ = fVar122 * *pfVar4 + auVar136._0_4_;
                auVar133._4_4_ = fVar132 * pfVar4[1] + auVar136._4_4_;
                auVar133._8_4_ = fVar128 * pfVar4[2] + auVar136._8_4_;
                auVar133._12_4_ = fVar137 * pfVar4[3] + auVar136._12_4_;
                auVar133._16_4_ = fVar129 * pfVar4[4] + auVar136._16_4_;
                auVar133._20_4_ = fVar138 * pfVar4[5] + auVar136._20_4_;
                auVar133._24_4_ = fVar130 * pfVar4[6] + auVar136._24_4_;
                auVar133._28_4_ = fVar131 + auVar136._28_4_;
                auVar136 = ZEXT3264(auVar133);
                pfVar4 = (float *)((long)pvVar72 + lVar74);
                in_ZMM9 = ZEXT3264(CONCAT428(fVar131,CONCAT424(fVar130 * pfVar4[6],
                                                               CONCAT420(fVar138 * pfVar4[5],
                                                                         CONCAT416(fVar129 * pfVar4[
                                                  4],CONCAT412(fVar137 * pfVar4[3],
                                                               CONCAT48(fVar128 * pfVar4[2],
                                                                        CONCAT44(fVar132 * pfVar4[1]
                                                                                 ,fVar122 * *pfVar4)
                                                                       )))))));
                pfVar7 = (float *)((long)pvVar70 + lVar74);
                in_ZMM10 = ZEXT3264(CONCAT428(fVar149,CONCAT424(fVar130 * pfVar7[6],
                                                                CONCAT420(fVar138 * pfVar7[5],
                                                                          CONCAT416(fVar129 * pfVar7
                                                  [4],CONCAT412(fVar137 * pfVar7[3],
                                                                CONCAT48(fVar128 * pfVar7[2],
                                                                         CONCAT44(fVar132 * pfVar7[1
                                                  ],fVar122 * *pfVar7))))))));
                in_ZMM6 = ZEXT3264(CONCAT428(fVar131 + in_ZMM6._28_4_,
                                             CONCAT424(fVar130 * pfVar4[6] + in_ZMM6._24_4_,
                                                       CONCAT420(fVar138 * pfVar4[5] +
                                                                 in_ZMM6._20_4_,
                                                                 CONCAT416(fVar129 * pfVar4[4] +
                                                                           in_ZMM6._16_4_,
                                                                           CONCAT412(fVar137 * 
                                                  pfVar4[3] + in_ZMM6._12_4_,
                                                  CONCAT48(fVar128 * pfVar4[2] + in_ZMM6._8_4_,
                                                           CONCAT44(fVar132 * pfVar4[1] +
                                                                    in_ZMM6._4_4_,
                                                                    fVar122 * *pfVar4 +
                                                                    in_ZMM6._0_4_))))))));
                auVar145._0_4_ = fVar122 * *pfVar7 + auVar146._0_4_;
                auVar145._4_4_ = fVar132 * pfVar7[1] + auVar146._4_4_;
                auVar145._8_4_ = fVar128 * pfVar7[2] + auVar146._8_4_;
                auVar145._12_4_ = fVar137 * pfVar7[3] + auVar146._12_4_;
                auVar145._16_4_ = fVar129 * pfVar7[4] + auVar146._16_4_;
                auVar145._20_4_ = fVar138 * pfVar7[5] + auVar146._20_4_;
                auVar145._24_4_ = fVar130 * pfVar7[6] + auVar146._24_4_;
                auVar145._28_4_ = fVar149 + auVar146._28_4_;
                auVar146 = ZEXT3264(auVar145);
                pfVar4 = (float *)((long)pvVar36 + lVar74);
                auVar102._0_4_ = fVar122 * *pfVar4 + auVar110._0_4_;
                auVar102._4_4_ = fVar132 * pfVar4[1] + auVar110._4_4_;
                auVar102._8_4_ = fVar128 * pfVar4[2] + auVar110._8_4_;
                auVar102._12_4_ = fVar137 * pfVar4[3] + auVar110._12_4_;
                auVar102._16_4_ = fVar129 * pfVar4[4] + auVar110._16_4_;
                auVar102._20_4_ = fVar138 * pfVar4[5] + auVar110._20_4_;
                auVar102._24_4_ = fVar130 * pfVar4[6] + auVar110._24_4_;
                auVar102._28_4_ = pfVar3[7] + auVar110._28_4_;
                auVar110 = ZEXT3264(auVar102);
                lVar74 = lVar74 + 0x20;
                iVar27 = iVar27 + -1;
              } while (1 < iVar27);
              pvVar43 = (void *)(lVar74 + (long)pvVar37);
              local_320 = (void *)((long)local_170 + lVar74);
              local_298 = (void *)((long)local_178 + lVar74);
              local_238 = (void *)((long)pvVar59 + lVar74);
              pvVar67 = (void *)((long)pvVar57 + lVar74);
              local_318 = (void *)((long)pvVar72 + lVar74);
              local_308 = (void *)((long)pvVar70 + lVar74);
              pvVar75 = (void *)(lVar74 + (long)pvVar36);
              pvVar50 = (void *)((long)pvVar47 + lVar74);
            }
            auVar102 = vhaddps_avx(auVar145,auVar102);
            auVar133 = vhaddps_avx(auVar133,in_ZMM6._0_32_);
            in_ZMM5 = ZEXT3264(auVar133);
            auVar102 = vhaddps_avx(auVar133,auVar102);
            auVar113 = vhaddps_avx(auVar113,auVar124);
            auVar78 = vhaddps_avx(auVar78,auVar92);
            auVar92 = vhaddps_avx(auVar78,auVar113);
            auVar78 = vblendps_avx(auVar92,auVar102,0xf0);
            auVar91 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar68 + lVar5 * 4)),
                                    ZEXT416(*(uint *)((long)pvVar68 + lVar5 * 4 + lVar30)),0x10);
            auVar91 = vinsertps_avx(auVar91,ZEXT416(*(uint *)((long)pvVar68 + lVar5 * 4 + lVar30 * 2
                                                             )),0x20);
            auVar91 = vinsertps_avx(auVar91,ZEXT416(*(uint *)((long)pvVar68 + lVar5 * 4 + lVar30 * 3
                                                             )),0x30);
            in_ZMM3 = ZEXT1664(auVar91);
            auVar92 = vperm2f128_avx(auVar92,auVar102,0x21);
            auVar147 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar68 + uVar46 * 8)),
                                     ZEXT416(*(uint *)((long)pvVar68 + uVar46 * 8 + lVar30)),0x10);
            auVar147 = vinsertps_avx(auVar147,ZEXT416(*(uint *)((long)pvVar68 +
                                                               uVar46 * 8 + lVar30 * 2)),0x20);
            auVar147 = vinsertps_avx(auVar147,ZEXT416(*(uint *)((long)pvVar68 +
                                                               uVar46 * 8 + lVar30 * 3)),0x30);
            auVar84 = ZEXT3264(CONCAT428(auVar78._28_4_ + auVar92._28_4_ + auVar91._12_4_,
                                         CONCAT424(auVar78._24_4_ + auVar92._24_4_ + auVar91._8_4_,
                                                   CONCAT420(auVar78._20_4_ + auVar92._20_4_ +
                                                             auVar91._4_4_,
                                                             CONCAT416(auVar78._16_4_ +
                                                                       auVar92._16_4_ +
                                                                       auVar91._0_4_,
                                                                       CONCAT412(auVar78._12_4_ +
                                                                                 auVar92._12_4_ +
                                                                                 auVar147._12_4_,
                                                                                 CONCAT48(auVar78.
                                                  _8_4_ + auVar92._8_4_ + auVar147._8_4_,
                                                  CONCAT44(auVar78._4_4_ + auVar92._4_4_ +
                                                           auVar147._4_4_,
                                                           auVar78._0_4_ + auVar92._0_4_ +
                                                           auVar147._0_4_))))))));
            if ((uVar8 & 7) != 0) {
              lVar74 = 0;
              iVar27 = iVar38;
              do {
                auVar91 = vinsertps_avx(ZEXT416(*(uint *)((long)local_198 + lVar74)),
                                        ZEXT416(*(uint *)((long)local_1a0 + lVar74)),0x10);
                auVar91 = vinsertps_avx(auVar91,ZEXT416(*(uint *)((long)pvVar40 + lVar74)),0x20);
                auVar91 = vinsertps_avx(auVar91,ZEXT416(*(uint *)((long)pvVar65 + lVar74)),0x30);
                auVar147 = vinsertps_avx(ZEXT416(*(uint *)((long)local_180 + lVar74)),
                                         ZEXT416(*(uint *)((long)local_188 + lVar74)),0x10);
                auVar147 = vinsertps_avx(auVar147,ZEXT416(*(uint *)((long)local_190 + lVar74)),0x20)
                ;
                auVar147 = vinsertps_avx(auVar147,ZEXT416(*(uint *)((long)pvVar60 + lVar74)),0x30);
                fVar122 = *(float *)((long)pvVar76 + lVar74);
                auVar84 = ZEXT3264(CONCAT428(auVar91._12_4_ + auVar84._28_4_,
                                             CONCAT424(auVar91._8_4_ * fVar122 + auVar84._24_4_,
                                                       CONCAT420(auVar91._4_4_ * fVar122 +
                                                                 auVar84._20_4_,
                                                                 CONCAT416(auVar91._0_4_ * fVar122 +
                                                                           auVar84._16_4_,
                                                                           CONCAT412(auVar147._12_4_
                                                                                     * fVar122 +
                                                                                     auVar84._12_4_,
                                                                                     CONCAT48(
                                                  auVar147._8_4_ * fVar122 + auVar84._8_4_,
                                                  CONCAT44(auVar147._4_4_ * fVar122 + auVar84._4_4_,
                                                           auVar147._0_4_ * fVar122 + auVar84._0_4_)
                                                  )))))));
                lVar74 = lVar74 + 4;
                iVar27 = iVar27 + -1;
              } while (1 < iVar27);
            }
            auVar79 = auVar84._0_32_;
            if ((_w & 7) != 0) {
              lVar74 = 0;
              iVar27 = iVar39;
              do {
                auVar91 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar67 + lVar74)),
                                        ZEXT416(*(uint *)((long)local_318 + lVar74)),0x10);
                auVar91 = vinsertps_avx(auVar91,ZEXT416(*(uint *)((long)local_308 + lVar74)),0x20);
                auVar91 = vinsertps_avx(auVar91,ZEXT416(*(uint *)((long)pvVar75 + lVar74)),0x30);
                auVar147 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar43 + lVar74)),
                                         ZEXT416(*(uint *)((long)local_320 + lVar74)),0x10);
                auVar147 = vinsertps_avx(auVar147,ZEXT416(*(uint *)((long)local_298 + lVar74)),0x20)
                ;
                auVar147 = vinsertps_avx(auVar147,ZEXT416(*(uint *)((long)local_238 + lVar74)),0x30)
                ;
                fVar122 = *(float *)((long)pvVar50 + lVar74);
                auVar79._0_4_ = auVar147._0_4_ * fVar122 + auVar84._0_4_;
                auVar79._4_4_ = auVar147._4_4_ * fVar122 + auVar84._4_4_;
                auVar79._8_4_ = auVar147._8_4_ * fVar122 + auVar84._8_4_;
                auVar79._12_4_ = auVar147._12_4_ * fVar122 + auVar84._12_4_;
                auVar79._16_4_ = auVar91._0_4_ * fVar122 + auVar84._16_4_;
                auVar79._20_4_ = auVar91._4_4_ * fVar122 + auVar84._20_4_;
                auVar79._24_4_ = auVar91._8_4_ * fVar122 + auVar84._24_4_;
                auVar79._28_4_ = auVar91._12_4_ + auVar84._28_4_;
                auVar84 = ZEXT3264(auVar79);
                lVar74 = lVar74 + 4;
                iVar27 = iVar27 + -1;
              } while (1 < iVar27);
            }
            *(int *)&((Allocator *)((long)local_78.data + uVar46 * 8))->_vptr_Allocator =
                 auVar79._0_4_;
            auVar91 = auVar79._0_16_;
            uVar10 = vextractps_avx(auVar91,1);
            *(undefined4 *)
             ((long)&((Allocator *)((long)local_78.data + uVar46 * 8))->_vptr_Allocator + lVar31) =
                 uVar10;
            uVar10 = vextractps_avx(auVar91,2);
            *(undefined4 *)
             ((long)&((Allocator *)((long)local_78.data + uVar46 * 8))->_vptr_Allocator + lVar31 * 2
             ) = uVar10;
            uVar10 = vextractps_avx(auVar91,3);
            *(undefined4 *)
             ((long)&((Allocator *)((long)local_78.data + uVar46 * 8))->_vptr_Allocator + lVar31 * 3
             ) = uVar10;
            auVar91 = auVar79._16_16_;
            *(int *)((long)&((Allocator *)((long)local_78.data + uVar46 * 8))->_vptr_Allocator + 4)
                 = auVar79._16_4_;
            uVar10 = vextractps_avx(auVar91,1);
            *(undefined4 *)
             ((long)&((Allocator *)((long)local_78.data + uVar46 * 8))->_vptr_Allocator + lVar31 + 4
             ) = uVar10;
            uVar10 = vextractps_avx(auVar91,2);
            *(undefined4 *)
             ((long)&((Allocator *)((long)local_78.data + uVar46 * 8))->_vptr_Allocator +
             lVar31 * 2 + 4) = uVar10;
            uVar10 = vextractps_avx(auVar91,3);
            *(undefined4 *)
             ((long)&((Allocator *)((long)local_78.data + uVar46 * 8))->_vptr_Allocator +
             lVar31 * 3 + 4) = uVar10;
            uVar46 = uVar46 + 1;
            pvVar54 = (void *)((long)pvVar54 + lVar32);
            pvVar53 = (void *)((long)pvVar53 + lVar32);
            pvVar66 = (void *)((long)pvVar66 + lVar32);
            pvVar69 = (void *)((long)pvVar69 + lVar32);
            pvVar61 = (void *)((long)pvVar61 + lVar32);
            pvVar71 = (void *)((long)pvVar71 + lVar32);
            pvVar49 = (void *)((long)pvVar49 + lVar32);
            local_168 = (void *)((long)local_168 + lVar32);
            pvVar37 = (void *)((long)pvVar37 + lVar33);
            local_170 = (void *)((long)local_170 + lVar33);
            local_178 = (void *)((long)local_178 + lVar33);
            pvVar59 = (void *)((long)pvVar59 + lVar33);
            pvVar57 = (void *)((long)pvVar57 + lVar33);
            pvVar72 = (void *)((long)pvVar72 + lVar33);
            pvVar70 = (void *)((long)pvVar70 + lVar33);
            pvVar36 = (void *)((long)pvVar36 + lVar33);
          } while (uVar46 != (uint)((int)_w >> 1));
        }
        auVar144._8_4_ = 0x3f800000;
        auVar144._0_8_ = 0x3f8000003f800000;
        auVar144._12_4_ = 0x3f800000;
        auVar144._16_4_ = 0x3f800000;
        auVar144._20_4_ = 0x3f800000;
        auVar144._24_4_ = 0x3f800000;
        auVar144._28_4_ = 0x3f800000;
        if ((uint)uVar48 != _w) {
          pvVar44 = (void *)(bottom_blob->w * lVar29 * bottom_blob->elemsize +
                            (long)bottom_blob->data);
          pvVar61 = bias_c->data;
          lVar32 = (long)bias_c->w * bias_c->elemsize;
          lVar33 = (long)local_78.w * local_78.elemsize;
          lVar30 = (long)weight_xc->w * weight_xc->elemsize;
          lVar31 = (long)weight_hc->w * weight_hc->elemsize;
          pvVar57 = weight_xc->data;
          pvVar45 = (void *)(lVar30 * (lVar35 + uVar48) + (long)pvVar57);
          pvVar59 = (void *)(lVar30 * (lVar28 + uVar48) + (long)pvVar57);
          pvVar47 = (void *)(lVar30 * (uVar56 + uVar48) + (long)pvVar57);
          pvVar71 = (void *)(lVar30 * uVar48 + (long)pvVar57);
          pvVar68 = weight_hc->data;
          pvVar49 = (void *)(lVar31 * (lVar35 + uVar48) + (long)pvVar68);
          pvVar37 = (void *)(lVar31 * (lVar28 + uVar48) + (long)pvVar68);
          pvVar36 = (void *)(lVar31 * (uVar56 + uVar48) + (long)pvVar68);
          pvVar54 = (void *)(lVar31 * uVar48 + (long)pvVar68);
          pvVar51 = hidden_state->data;
          uVar46 = uVar48;
          do {
            lVar42 = uVar46 + uVar56 * 2;
            lVar62 = uVar46 + uVar56 * 3;
            if (iVar52 < 1) {
              pvVar72 = (void *)(lVar30 * uVar46 + (long)pvVar57);
              pvVar69 = (void *)(lVar30 * (uVar46 + uVar56) + (long)pvVar57);
              pvVar66 = (void *)(lVar30 * lVar42 + (long)pvVar57);
              pvVar53 = (void *)(lVar30 * lVar62 + (long)pvVar57);
              auVar99 = ZEXT864(0);
              auVar110 = ZEXT864(0);
              in_ZMM3 = ZEXT864(0);
              auVar84 = ZEXT864(0);
              pvVar70 = pvVar44;
            }
            else {
              auVar84 = ZEXT864(0);
              lVar74 = 0;
              in_ZMM3 = ZEXT864(0);
              auVar110 = ZEXT864(0);
              auVar99 = ZEXT864(0);
              auVar121 = in_ZMM6;
              iVar27 = iVar52 + 1;
              do {
                pfVar3 = (float *)((long)pvVar44 + lVar74);
                fVar122 = *pfVar3;
                fVar132 = pfVar3[1];
                fVar128 = pfVar3[2];
                fVar137 = pfVar3[3];
                fVar129 = pfVar3[4];
                fVar138 = pfVar3[5];
                fVar130 = pfVar3[6];
                pfVar4 = (float *)((long)pvVar71 + lVar74);
                fVar131 = in_ZMM5._28_4_;
                auVar99 = ZEXT3264(CONCAT428(fVar131 + auVar99._28_4_,
                                             CONCAT424(fVar130 * pfVar4[6] + auVar99._24_4_,
                                                       CONCAT420(fVar138 * pfVar4[5] +
                                                                 auVar99._20_4_,
                                                                 CONCAT416(fVar129 * pfVar4[4] +
                                                                           auVar99._16_4_,
                                                                           CONCAT412(fVar137 * 
                                                  pfVar4[3] + auVar99._12_4_,
                                                  CONCAT48(fVar128 * pfVar4[2] + auVar99._8_4_,
                                                           CONCAT44(fVar132 * pfVar4[1] +
                                                                    auVar99._4_4_,
                                                                    fVar122 * *pfVar4 +
                                                                    auVar99._0_4_))))))));
                pfVar4 = (float *)((long)pvVar47 + lVar74);
                in_ZMM5 = ZEXT3264(CONCAT428(fVar131,CONCAT424(fVar130 * pfVar4[6],
                                                               CONCAT420(fVar138 * pfVar4[5],
                                                                         CONCAT416(fVar129 * pfVar4[
                                                  4],CONCAT412(fVar137 * pfVar4[3],
                                                               CONCAT48(fVar128 * pfVar4[2],
                                                                        CONCAT44(fVar132 * pfVar4[1]
                                                                                 ,fVar122 * *pfVar4)
                                                                       )))))));
                pfVar7 = (float *)((long)pvVar59 + lVar74);
                auVar127._0_4_ = fVar122 * *pfVar7;
                auVar127._4_4_ = fVar132 * pfVar7[1];
                auVar127._8_4_ = fVar128 * pfVar7[2];
                auVar127._12_4_ = fVar137 * pfVar7[3];
                auVar127._16_4_ = fVar129 * pfVar7[4];
                auVar127._20_4_ = fVar138 * pfVar7[5];
                auVar127._28_36_ = auVar121._28_36_;
                auVar127._24_4_ = fVar130 * pfVar7[6];
                in_ZMM6 = ZEXT3264(auVar127._0_32_);
                auVar110 = ZEXT3264(CONCAT428(fVar131 + auVar110._28_4_,
                                              CONCAT424(fVar130 * pfVar4[6] + auVar110._24_4_,
                                                        CONCAT420(fVar138 * pfVar4[5] +
                                                                  auVar110._20_4_,
                                                                  CONCAT416(fVar129 * pfVar4[4] +
                                                                            auVar110._16_4_,
                                                                            CONCAT412(fVar137 * 
                                                  pfVar4[3] + auVar110._12_4_,
                                                  CONCAT48(fVar128 * pfVar4[2] + auVar110._8_4_,
                                                           CONCAT44(fVar132 * pfVar4[1] +
                                                                    auVar110._4_4_,
                                                                    fVar122 * *pfVar4 +
                                                                    auVar110._0_4_))))))));
                in_ZMM3 = ZEXT3264(CONCAT428(auVar121._28_4_ + in_ZMM3._28_4_,
                                             CONCAT424(auVar127._24_4_ + in_ZMM3._24_4_,
                                                       CONCAT420(auVar127._20_4_ + in_ZMM3._20_4_,
                                                                 CONCAT416(auVar127._16_4_ +
                                                                           in_ZMM3._16_4_,
                                                                           CONCAT412(auVar127._12_4_
                                                                                     + in_ZMM3.
                                                  _12_4_,CONCAT48(auVar127._8_4_ + in_ZMM3._8_4_,
                                                                  CONCAT44(auVar127._4_4_ +
                                                                           in_ZMM3._4_4_,
                                                                           auVar127._0_4_ +
                                                                           in_ZMM3._0_4_))))))));
                pfVar4 = (float *)((long)pvVar45 + lVar74);
                auVar84 = ZEXT3264(CONCAT428(pfVar3[7] + auVar84._28_4_,
                                             CONCAT424(fVar130 * pfVar4[6] + auVar84._24_4_,
                                                       CONCAT420(fVar138 * pfVar4[5] +
                                                                 auVar84._20_4_,
                                                                 CONCAT416(fVar129 * pfVar4[4] +
                                                                           auVar84._16_4_,
                                                                           CONCAT412(fVar137 * 
                                                  pfVar4[3] + auVar84._12_4_,
                                                  CONCAT48(fVar128 * pfVar4[2] + auVar84._8_4_,
                                                           CONCAT44(fVar132 * pfVar4[1] +
                                                                    auVar84._4_4_,
                                                                    fVar122 * *pfVar4 +
                                                                    auVar84._0_4_))))))));
                iVar27 = iVar27 + -1;
                lVar74 = lVar74 + 0x20;
                auVar121 = in_ZMM6;
              } while (1 < iVar27);
              pvVar53 = (void *)((long)pvVar45 + lVar74);
              pvVar66 = (void *)(lVar74 + (long)pvVar59);
              pvVar69 = (void *)(lVar74 + (long)pvVar47);
              pvVar72 = (void *)((long)pvVar71 + lVar74);
              pvVar70 = (void *)(lVar74 + (long)pvVar44);
            }
            auVar103 = auVar110._0_32_;
            auVar93 = auVar99._0_32_;
            auVar80 = auVar84._0_32_;
            if (iVar58 < 1) {
              pvVar65 = (void *)(lVar31 * uVar46 + (long)pvVar68);
              pvVar76 = (void *)((uVar46 + uVar56) * lVar31 + (long)pvVar68);
              pvVar60 = (void *)(lVar42 * lVar31 + (long)pvVar68);
              pvVar40 = (void *)(lVar62 * lVar31 + (long)pvVar68);
              pvVar43 = pvVar51;
            }
            else {
              lVar42 = 0;
              auVar121 = in_ZMM6;
              iVar27 = iVar58 + 1;
              do {
                pfVar3 = (float *)((long)pvVar51 + lVar42);
                fVar122 = *pfVar3;
                fVar132 = pfVar3[1];
                fVar128 = pfVar3[2];
                fVar137 = pfVar3[3];
                fVar129 = pfVar3[4];
                fVar138 = pfVar3[5];
                fVar130 = pfVar3[6];
                pfVar4 = (float *)((long)pvVar54 + lVar42);
                auVar93._0_4_ = fVar122 * *pfVar4 + auVar99._0_4_;
                auVar93._4_4_ = fVar132 * pfVar4[1] + auVar99._4_4_;
                auVar93._8_4_ = fVar128 * pfVar4[2] + auVar99._8_4_;
                auVar93._12_4_ = fVar137 * pfVar4[3] + auVar99._12_4_;
                auVar93._16_4_ = fVar129 * pfVar4[4] + auVar99._16_4_;
                auVar93._20_4_ = fVar138 * pfVar4[5] + auVar99._20_4_;
                auVar93._24_4_ = fVar130 * pfVar4[6] + auVar99._24_4_;
                fVar131 = in_ZMM5._28_4_;
                auVar93._28_4_ = fVar131 + auVar99._28_4_;
                auVar99 = ZEXT3264(auVar93);
                pfVar4 = (float *)((long)pvVar36 + lVar42);
                in_ZMM5 = ZEXT3264(CONCAT428(fVar131,CONCAT424(fVar130 * pfVar4[6],
                                                               CONCAT420(fVar138 * pfVar4[5],
                                                                         CONCAT416(fVar129 * pfVar4[
                                                  4],CONCAT412(fVar137 * pfVar4[3],
                                                               CONCAT48(fVar128 * pfVar4[2],
                                                                        CONCAT44(fVar132 * pfVar4[1]
                                                                                 ,fVar122 * *pfVar4)
                                                                       )))))));
                pfVar7 = (float *)((long)pvVar37 + lVar42);
                auVar136._0_4_ = fVar122 * *pfVar7;
                auVar136._4_4_ = fVar132 * pfVar7[1];
                auVar136._8_4_ = fVar128 * pfVar7[2];
                auVar136._12_4_ = fVar137 * pfVar7[3];
                auVar136._16_4_ = fVar129 * pfVar7[4];
                auVar136._20_4_ = fVar138 * pfVar7[5];
                auVar136._28_36_ = auVar121._28_36_;
                auVar136._24_4_ = fVar130 * pfVar7[6];
                in_ZMM6 = ZEXT3264(auVar136._0_32_);
                auVar103._0_4_ = fVar122 * *pfVar4 + auVar110._0_4_;
                auVar103._4_4_ = fVar132 * pfVar4[1] + auVar110._4_4_;
                auVar103._8_4_ = fVar128 * pfVar4[2] + auVar110._8_4_;
                auVar103._12_4_ = fVar137 * pfVar4[3] + auVar110._12_4_;
                auVar103._16_4_ = fVar129 * pfVar4[4] + auVar110._16_4_;
                auVar103._20_4_ = fVar138 * pfVar4[5] + auVar110._20_4_;
                auVar103._24_4_ = fVar130 * pfVar4[6] + auVar110._24_4_;
                auVar103._28_4_ = fVar131 + auVar110._28_4_;
                auVar110 = ZEXT3264(auVar103);
                in_ZMM3 = ZEXT3264(CONCAT428(auVar121._28_4_ + in_ZMM3._28_4_,
                                             CONCAT424(auVar136._24_4_ + in_ZMM3._24_4_,
                                                       CONCAT420(auVar136._20_4_ + in_ZMM3._20_4_,
                                                                 CONCAT416(auVar136._16_4_ +
                                                                           in_ZMM3._16_4_,
                                                                           CONCAT412(auVar136._12_4_
                                                                                     + in_ZMM3.
                                                  _12_4_,CONCAT48(auVar136._8_4_ + in_ZMM3._8_4_,
                                                                  CONCAT44(auVar136._4_4_ +
                                                                           in_ZMM3._4_4_,
                                                                           auVar136._0_4_ +
                                                                           in_ZMM3._0_4_))))))));
                pfVar4 = (float *)((long)pvVar49 + lVar42);
                auVar80._0_4_ = fVar122 * *pfVar4 + auVar84._0_4_;
                auVar80._4_4_ = fVar132 * pfVar4[1] + auVar84._4_4_;
                auVar80._8_4_ = fVar128 * pfVar4[2] + auVar84._8_4_;
                auVar80._12_4_ = fVar137 * pfVar4[3] + auVar84._12_4_;
                auVar80._16_4_ = fVar129 * pfVar4[4] + auVar84._16_4_;
                auVar80._20_4_ = fVar138 * pfVar4[5] + auVar84._20_4_;
                auVar80._24_4_ = fVar130 * pfVar4[6] + auVar84._24_4_;
                auVar80._28_4_ = pfVar3[7] + auVar84._28_4_;
                auVar84 = ZEXT3264(auVar80);
                iVar27 = iVar27 + -1;
                lVar42 = lVar42 + 0x20;
                auVar121 = in_ZMM6;
              } while (1 < iVar27);
              pvVar40 = (void *)((long)pvVar49 + lVar42);
              pvVar60 = (void *)((long)pvVar37 + lVar42);
              pvVar76 = (void *)((long)pvVar36 + lVar42);
              pvVar65 = (void *)((long)pvVar54 + lVar42);
              pvVar43 = (void *)(lVar42 + (long)pvVar51);
            }
            auVar78 = vhaddps_avx(in_ZMM3._0_32_,auVar80);
            auVar92 = vhaddps_avx(auVar93,auVar103);
            auVar78 = vhaddps_avx(auVar92,auVar78);
            auVar91 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar61 + uVar46 * 4)),
                                    ZEXT416(*(uint *)((long)pvVar61 + uVar46 * 4 + lVar32)),0x10);
            auVar91 = vinsertps_avx(auVar91,ZEXT416(*(uint *)((long)pvVar61 +
                                                             uVar46 * 4 + lVar32 * 2)),0x20);
            auVar91 = vinsertps_avx(auVar91,ZEXT416(*(uint *)((long)pvVar61 +
                                                             uVar46 * 4 + lVar32 * 3)),0x30);
            auVar84 = ZEXT1664(CONCAT412(auVar91._12_4_ + auVar78._12_4_ + auVar78._28_4_,
                                         CONCAT48(auVar91._8_4_ + auVar78._8_4_ + auVar78._24_4_,
                                                  CONCAT44(auVar91._4_4_ + auVar78._4_4_ +
                                                           auVar78._20_4_,
                                                           auVar91._0_4_ + auVar78._0_4_ +
                                                           auVar78._16_4_))));
            if ((uVar8 & 7) != 0) {
              lVar42 = 0;
              iVar27 = iVar38;
              do {
                auVar91 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar72 + lVar42)),
                                        ZEXT416(*(uint *)((long)pvVar69 + lVar42)),0x10);
                auVar91 = vinsertps_avx(auVar91,ZEXT416(*(uint *)((long)pvVar66 + lVar42)),0x20);
                auVar91 = vinsertps_avx(auVar91,ZEXT416(*(uint *)((long)pvVar53 + lVar42)),0x30);
                fVar122 = *(float *)((long)pvVar70 + lVar42);
                auVar84 = ZEXT1664(CONCAT412(auVar91._12_4_ * fVar122 + auVar84._12_4_,
                                             CONCAT48(auVar91._8_4_ * fVar122 + auVar84._8_4_,
                                                      CONCAT44(auVar91._4_4_ * fVar122 +
                                                               auVar84._4_4_,
                                                               auVar91._0_4_ * fVar122 +
                                                               auVar84._0_4_))));
                iVar27 = iVar27 + -1;
                lVar42 = lVar42 + 4;
              } while (1 < iVar27);
            }
            auVar91 = auVar84._0_16_;
            if ((uVar56 & 7) != 0) {
              lVar42 = 0;
              iVar27 = iVar39;
              do {
                auVar91 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar65 + lVar42)),
                                        ZEXT416(*(uint *)((long)pvVar76 + lVar42)),0x10);
                auVar91 = vinsertps_avx(auVar91,ZEXT416(*(uint *)((long)pvVar60 + lVar42)),0x20);
                auVar147 = vinsertps_avx(auVar91,ZEXT416(*(uint *)((long)pvVar40 + lVar42)),0x30);
                fVar122 = *(float *)((long)pvVar43 + lVar42);
                auVar91._0_4_ = auVar147._0_4_ * fVar122 + auVar84._0_4_;
                auVar91._4_4_ = auVar147._4_4_ * fVar122 + auVar84._4_4_;
                auVar91._8_4_ = auVar147._8_4_ * fVar122 + auVar84._8_4_;
                auVar91._12_4_ = auVar147._12_4_ * fVar122 + auVar84._12_4_;
                auVar84 = ZEXT1664(auVar91);
                iVar27 = iVar27 + -1;
                lVar42 = lVar42 + 4;
              } while (1 < iVar27);
            }
            *(int *)((long)(_func_int ***)local_78.data + uVar46 * 4) = auVar91._0_4_;
            uVar10 = vextractps_avx(auVar91,1);
            *(undefined4 *)((long)(_func_int ***)local_78.data + uVar46 * 4 + lVar33) = uVar10;
            uVar10 = vextractps_avx(auVar91,2);
            *(undefined4 *)((long)(_func_int ***)local_78.data + uVar46 * 4 + lVar33 * 2) = uVar10;
            uVar10 = vextractps_avx(auVar91,3);
            *(undefined4 *)((long)(_func_int ***)local_78.data + uVar46 * 4 + lVar33 * 3) = uVar10;
            uVar46 = uVar46 + 1;
            pvVar45 = (void *)((long)pvVar45 + lVar30);
            pvVar59 = (void *)((long)pvVar59 + lVar30);
            pvVar47 = (void *)((long)pvVar47 + lVar30);
            pvVar71 = (void *)((long)pvVar71 + lVar30);
            pvVar49 = (void *)((long)pvVar49 + lVar31);
            pvVar37 = (void *)((long)pvVar37 + lVar31);
            pvVar36 = (void *)((long)pvVar36 + lVar31);
            pvVar54 = (void *)((long)pvVar54 + lVar31);
          } while ((long)uVar46 < (long)uVar56);
        }
        pvVar44 = (void *)(top_blob->w * lVar29 * top_blob->elemsize + (long)top_blob->data);
        lVar29 = (long)local_78.w * local_78.elemsize;
        ppp_Var41 = (_func_int ***)((long)(_func_int ***)local_78.data + lVar29);
        pvVar51 = (void *)((long)(_func_int ***)local_78.data + lVar29 * 3);
        pvVar57 = cell_state->data;
        pvVar68 = hidden_state->data;
        pvVar61 = (void *)((long)(_func_int ***)local_78.data + lVar29 * 2);
        pAVar55 = (Allocator *)local_78.data;
        if (0 < iVar58) {
          auVar147._8_4_ = 0x3f800000;
          auVar147._0_8_ = 0x3f8000003f800000;
          auVar147._12_4_ = 0x3f800000;
          in_ZMM9 = ZEXT1664(auVar147);
          lVar29 = 0;
          iVar27 = iVar58 + 1;
          do {
            lVar32 = lVar29;
            auVar78 = *(undefined1 (*) [32])((long)(_func_int ***)local_78.data + lVar32);
            auVar81._0_8_ = auVar78._0_8_ ^ 0x8000000080000000;
            auVar81._8_4_ = auVar78._8_4_ ^ 0x80000000;
            auVar81._12_4_ = auVar78._12_4_ ^ 0x80000000;
            auVar81._16_4_ = auVar78._16_4_ ^ 0x80000000;
            auVar81._20_4_ = auVar78._20_4_ ^ 0x80000000;
            auVar81._24_4_ = auVar78._24_4_ ^ 0x80000000;
            auVar81._28_4_ = auVar78._28_4_ ^ 0x80000000;
            auVar148._8_4_ = 0x42b0c0a5;
            auVar148._0_8_ = 0x42b0c0a542b0c0a5;
            auVar148._12_4_ = 0x42b0c0a5;
            auVar148._16_4_ = 0x42b0c0a5;
            auVar148._20_4_ = 0x42b0c0a5;
            auVar148._24_4_ = 0x42b0c0a5;
            auVar148._28_4_ = 0x42b0c0a5;
            in_ZMM10 = ZEXT3264(auVar148);
            auVar78 = vminps_avx(auVar148,auVar81);
            auVar94._8_4_ = 0xc2b0c0a5;
            auVar94._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar94._12_4_ = 0xc2b0c0a5;
            auVar94._16_4_ = 0xc2b0c0a5;
            auVar94._20_4_ = 0xc2b0c0a5;
            auVar94._24_4_ = 0xc2b0c0a5;
            auVar94._28_4_ = 0xc2b0c0a5;
            auVar92 = vmaxps_avx(auVar78,auVar94);
            auVar95._0_4_ = auVar92._0_4_ * 1.442695 + 0.5;
            auVar95._4_4_ = auVar92._4_4_ * 1.442695 + 0.5;
            auVar95._8_4_ = auVar92._8_4_ * 1.442695 + 0.5;
            auVar95._12_4_ = auVar92._12_4_ * 1.442695 + 0.5;
            auVar95._16_4_ = auVar92._16_4_ * 1.442695 + 0.5;
            auVar95._20_4_ = auVar92._20_4_ * 1.442695 + 0.5;
            auVar95._24_4_ = auVar92._24_4_ * 1.442695 + 0.5;
            auVar95._28_4_ = 0xc2afc0a5;
            auVar102 = vroundps_avx(auVar95,1);
            auVar78 = vcmpps_avx(auVar95,auVar102,1);
            auVar78 = vandps_avx(auVar78,auVar144);
            auVar78 = vsubps_avx(auVar102,auVar78);
            auVar13._4_4_ = auVar78._4_4_ * 0.6931472;
            auVar13._0_4_ = auVar78._0_4_ * 0.6931472;
            auVar13._8_4_ = auVar78._8_4_ * 0.6931472;
            auVar13._12_4_ = auVar78._12_4_ * 0.6931472;
            auVar13._16_4_ = auVar78._16_4_ * 0.6931472;
            auVar13._20_4_ = auVar78._20_4_ * 0.6931472;
            auVar13._24_4_ = auVar78._24_4_ * 0.6931472;
            auVar13._28_4_ = auVar102._28_4_;
            auVar92 = vsubps_avx(auVar92,auVar13);
            fVar122 = auVar92._0_4_;
            fVar132 = auVar92._4_4_;
            fVar128 = auVar92._8_4_;
            fVar137 = auVar92._12_4_;
            fVar129 = auVar92._16_4_;
            fVar138 = auVar92._20_4_;
            fVar130 = auVar92._24_4_;
            auVar100._0_4_ = (int)auVar78._0_4_;
            auVar100._4_4_ = (int)auVar78._4_4_;
            auVar100._8_4_ = (int)auVar78._8_4_;
            auVar100._12_4_ = (int)auVar78._12_4_;
            auVar96._16_4_ = (int)auVar78._16_4_;
            auVar96._0_16_ = auVar100;
            auVar96._20_4_ = (int)auVar78._20_4_;
            auVar96._24_4_ = (int)auVar78._24_4_;
            auVar96._28_4_ = (int)auVar78._28_4_;
            auVar100 = vpslld_avx(auVar100,0x17);
            auVar91 = vpslld_avx(auVar96._16_16_,0x17);
            auVar91 = vpaddd_avx(auVar147,auVar91);
            auVar100 = vpaddd_avx(auVar147,auVar100);
            auVar104._0_4_ =
                 (fVar122 + 1.0 +
                 fVar122 * fVar122 *
                 (((((fVar122 * 0.00019875691 + 0.0013981999) * fVar122 + 0.008333452) * fVar122 +
                   0.041665796) * fVar122 + 0.16666666) * fVar122 + 0.5)) * auVar100._0_4_ + 1.0;
            auVar104._4_4_ =
                 (fVar132 + 1.0 +
                 fVar132 * fVar132 *
                 (((((fVar132 * 0.00019875691 + 0.0013981999) * fVar132 + 0.008333452) * fVar132 +
                   0.041665796) * fVar132 + 0.16666666) * fVar132 + 0.5)) * auVar100._4_4_ + 1.0;
            auVar104._8_4_ =
                 (fVar128 + 1.0 +
                 fVar128 * fVar128 *
                 (((((fVar128 * 0.00019875691 + 0.0013981999) * fVar128 + 0.008333452) * fVar128 +
                   0.041665796) * fVar128 + 0.16666666) * fVar128 + 0.5)) * auVar100._8_4_ + 1.0;
            auVar104._12_4_ =
                 (fVar137 + 1.0 +
                 fVar137 * fVar137 *
                 (((((fVar137 * 0.00019875691 + 0.0013981999) * fVar137 + 0.008333452) * fVar137 +
                   0.041665796) * fVar137 + 0.16666666) * fVar137 + 0.5)) * auVar100._12_4_ + 1.0;
            auVar104._16_4_ =
                 (fVar129 + 1.0 +
                 fVar129 * fVar129 *
                 (((((fVar129 * 0.00019875691 + 0.0013981999) * fVar129 + 0.008333452) * fVar129 +
                   0.041665796) * fVar129 + 0.16666666) * fVar129 + 0.5)) * auVar91._0_4_ + 1.0;
            auVar104._20_4_ =
                 (fVar138 + 1.0 +
                 fVar138 * fVar138 *
                 (((((fVar138 * 0.00019875691 + 0.0013981999) * fVar138 + 0.008333452) * fVar138 +
                   0.041665796) * fVar138 + 0.16666666) * fVar138 + 0.5)) * auVar91._4_4_ + 1.0;
            auVar104._24_4_ =
                 (fVar130 + 1.0 +
                 fVar130 * fVar130 *
                 (((((fVar130 * 0.00019875691 + 0.0013981999) * fVar130 + 0.008333452) * fVar130 +
                   0.041665796) * fVar130 + 0.16666666) * fVar130 + 0.5)) * auVar91._8_4_ + 1.0;
            auVar104._28_4_ = auVar92._28_4_ + 1.0 + auVar102._28_4_ + 1.0;
            auVar102 = vrcpps_avx(auVar104);
            pfVar3 = (float *)((long)pvVar51 + lVar32);
            auVar14._4_4_ = pfVar3[1] * -2.0;
            auVar14._0_4_ = *pfVar3 * -2.0;
            auVar14._8_4_ = pfVar3[2] * -2.0;
            auVar14._12_4_ = pfVar3[3] * -2.0;
            auVar14._16_4_ = pfVar3[4] * -2.0;
            auVar14._20_4_ = pfVar3[5] * -2.0;
            auVar14._24_4_ = pfVar3[6] * -2.0;
            auVar14._28_4_ = 0xc0000000;
            auVar78 = vminps_avx(auVar148,auVar14);
            auVar92 = vmaxps_avx(auVar78,auVar94);
            auVar114._0_4_ = auVar92._0_4_ * 1.442695 + 0.5;
            auVar114._4_4_ = auVar92._4_4_ * 1.442695 + 0.5;
            auVar114._8_4_ = auVar92._8_4_ * 1.442695 + 0.5;
            auVar114._12_4_ = auVar92._12_4_ * 1.442695 + 0.5;
            auVar114._16_4_ = auVar92._16_4_ * 1.442695 + 0.5;
            auVar114._20_4_ = auVar92._20_4_ * 1.442695 + 0.5;
            auVar114._24_4_ = auVar92._24_4_ * 1.442695 + 0.5;
            auVar114._28_4_ =
                 in_ZMM3._28_4_ + 0.0013981999 + 0.008333452 + 0.041665796 + 0.16666666 + 0.5 + 0.5;
            auVar113 = vroundps_avx(auVar114,1);
            auVar78 = vcmpps_avx(auVar114,auVar113,1);
            auVar78 = vandps_avx(auVar78,auVar144);
            auVar78 = vsubps_avx(auVar113,auVar78);
            auVar15._4_4_ = auVar78._4_4_ * 0.6931472;
            auVar15._0_4_ = auVar78._0_4_ * 0.6931472;
            auVar15._8_4_ = auVar78._8_4_ * 0.6931472;
            auVar15._12_4_ = auVar78._12_4_ * 0.6931472;
            auVar15._16_4_ = auVar78._16_4_ * 0.6931472;
            auVar15._20_4_ = auVar78._20_4_ * 0.6931472;
            auVar15._24_4_ = auVar78._24_4_ * 0.6931472;
            auVar15._28_4_ = auVar113._28_4_;
            auVar92 = vsubps_avx(auVar92,auVar15);
            fVar122 = auVar92._0_4_;
            fVar132 = auVar92._4_4_;
            fVar128 = auVar92._8_4_;
            fVar137 = auVar92._12_4_;
            fVar129 = auVar92._16_4_;
            fVar138 = auVar92._20_4_;
            fVar130 = auVar92._24_4_;
            auVar111._0_4_ = (int)auVar78._0_4_;
            auVar111._4_4_ = (int)auVar78._4_4_;
            auVar111._8_4_ = (int)auVar78._8_4_;
            auVar111._12_4_ = (int)auVar78._12_4_;
            auVar115._16_4_ = (int)auVar78._16_4_;
            auVar115._0_16_ = auVar111;
            auVar115._20_4_ = (int)auVar78._20_4_;
            auVar115._24_4_ = (int)auVar78._24_4_;
            auVar115._28_4_ = (int)auVar78._28_4_;
            auVar100 = vpslld_avx(auVar111,0x17);
            auVar91 = vpslld_avx(auVar115._16_16_,0x17);
            auVar91 = vpaddd_avx(auVar147,auVar91);
            auVar100 = vpaddd_avx(auVar147,auVar100);
            auVar82._0_4_ =
                 (fVar122 + 1.0 +
                 fVar122 * fVar122 *
                 (((((fVar122 * 0.00019875691 + 0.0013981999) * fVar122 + 0.008333452) * fVar122 +
                   0.041665796) * fVar122 + 0.16666666) * fVar122 + 0.5)) * auVar100._0_4_ + 1.0;
            auVar82._4_4_ =
                 (fVar132 + 1.0 +
                 fVar132 * fVar132 *
                 (((((fVar132 * 0.00019875691 + 0.0013981999) * fVar132 + 0.008333452) * fVar132 +
                   0.041665796) * fVar132 + 0.16666666) * fVar132 + 0.5)) * auVar100._4_4_ + 1.0;
            auVar82._8_4_ =
                 (fVar128 + 1.0 +
                 fVar128 * fVar128 *
                 (((((fVar128 * 0.00019875691 + 0.0013981999) * fVar128 + 0.008333452) * fVar128 +
                   0.041665796) * fVar128 + 0.16666666) * fVar128 + 0.5)) * auVar100._8_4_ + 1.0;
            auVar82._12_4_ =
                 (fVar137 + 1.0 +
                 fVar137 * fVar137 *
                 (((((fVar137 * 0.00019875691 + 0.0013981999) * fVar137 + 0.008333452) * fVar137 +
                   0.041665796) * fVar137 + 0.16666666) * fVar137 + 0.5)) * auVar100._12_4_ + 1.0;
            auVar82._16_4_ =
                 (fVar129 + 1.0 +
                 fVar129 * fVar129 *
                 (((((fVar129 * 0.00019875691 + 0.0013981999) * fVar129 + 0.008333452) * fVar129 +
                   0.041665796) * fVar129 + 0.16666666) * fVar129 + 0.5)) * auVar91._0_4_ + 1.0;
            auVar82._20_4_ =
                 (fVar138 + 1.0 +
                 fVar138 * fVar138 *
                 (((((fVar138 * 0.00019875691 + 0.0013981999) * fVar138 + 0.008333452) * fVar138 +
                   0.041665796) * fVar138 + 0.16666666) * fVar138 + 0.5)) * auVar91._4_4_ + 1.0;
            auVar82._24_4_ =
                 (fVar130 + 1.0 +
                 fVar130 * fVar130 *
                 (((((fVar130 * 0.00019875691 + 0.0013981999) * fVar130 + 0.008333452) * fVar130 +
                   0.041665796) * fVar130 + 0.16666666) * fVar130 + 0.5)) * auVar91._8_4_ + 1.0;
            auVar82._28_4_ = auVar92._28_4_ + 1.0 + auVar113._28_4_ + 1.0;
            auVar78 = vrcpps_avx(auVar82);
            fVar122 = auVar78._0_4_;
            fVar132 = auVar78._4_4_;
            fVar128 = auVar78._8_4_;
            fVar137 = auVar78._12_4_;
            fVar129 = auVar78._16_4_;
            fVar138 = auVar78._20_4_;
            fVar130 = auVar78._24_4_;
            auVar16._4_4_ = auVar82._4_4_ * (fVar132 + fVar132);
            auVar16._0_4_ = auVar82._0_4_ * (fVar122 + fVar122);
            auVar16._8_4_ = auVar82._8_4_ * (fVar128 + fVar128);
            auVar16._12_4_ = auVar82._12_4_ * (fVar137 + fVar137);
            auVar16._16_4_ = auVar82._16_4_ * (fVar129 + fVar129);
            auVar16._20_4_ = auVar82._20_4_ * (fVar138 + fVar138);
            auVar16._24_4_ = auVar82._24_4_ * (fVar130 + fVar130);
            auVar16._28_4_ = auVar82._28_4_;
            auVar134._8_4_ = 0x40000000;
            auVar134._0_8_ = 0x4000000040000000;
            auVar134._12_4_ = 0x40000000;
            auVar134._16_4_ = 0x40000000;
            auVar134._20_4_ = 0x40000000;
            auVar134._24_4_ = 0x40000000;
            auVar134._28_4_ = 0x40000000;
            auVar92 = vsubps_avx(auVar134,auVar16);
            fVar131 = auVar92._28_4_;
            auVar116._0_4_ = fVar122 + fVar122 + -1.0 + fVar122 * auVar92._0_4_;
            auVar116._4_4_ = fVar132 + fVar132 + -1.0 + fVar132 * auVar92._4_4_;
            auVar116._8_4_ = fVar128 + fVar128 + -1.0 + fVar128 * auVar92._8_4_;
            auVar116._12_4_ = fVar137 + fVar137 + -1.0 + fVar137 * auVar92._12_4_;
            auVar116._16_4_ = fVar129 + fVar129 + -1.0 + fVar129 * auVar92._16_4_;
            auVar116._20_4_ = fVar138 + fVar138 + -1.0 + fVar138 * auVar92._20_4_;
            auVar116._24_4_ = fVar130 + fVar130 + -1.0 + fVar130 * auVar92._24_4_;
            auVar116._28_4_ = auVar78._28_4_ + auVar78._28_4_ + -1.0 + fVar131;
            fVar77 = auVar116._0_4_ * auVar102._0_4_;
            fVar85 = auVar116._4_4_ * auVar102._4_4_;
            fVar86 = auVar116._8_4_ * auVar102._8_4_;
            fVar87 = auVar116._12_4_ * auVar102._12_4_;
            fVar88 = auVar116._16_4_ * auVar102._16_4_;
            fVar89 = auVar116._20_4_ * auVar102._20_4_;
            fVar90 = auVar116._24_4_ * auVar102._24_4_;
            auVar17._4_4_ = auVar104._4_4_ * fVar85;
            auVar17._0_4_ = auVar104._0_4_ * fVar77;
            auVar17._8_4_ = auVar104._8_4_ * fVar86;
            auVar17._12_4_ = auVar104._12_4_ * fVar87;
            auVar17._16_4_ = auVar104._16_4_ * fVar88;
            auVar17._20_4_ = auVar104._20_4_ * fVar89;
            auVar17._24_4_ = auVar104._24_4_ * fVar90;
            auVar17._28_4_ = auVar104._28_4_;
            auVar133 = vsubps_avx(auVar116,auVar17);
            auVar78 = *(undefined1 (*) [32])((long)ppp_Var41 + lVar32);
            auVar105._0_8_ = auVar78._0_8_ ^ 0x8000000080000000;
            auVar105._8_4_ = auVar78._8_4_ ^ 0x80000000;
            auVar105._12_4_ = auVar78._12_4_ ^ 0x80000000;
            auVar105._16_4_ = auVar78._16_4_ ^ 0x80000000;
            auVar105._20_4_ = auVar78._20_4_ ^ 0x80000000;
            auVar105._24_4_ = auVar78._24_4_ ^ 0x80000000;
            auVar105._28_4_ = auVar78._28_4_ ^ 0x80000000;
            auVar78 = vminps_avx(auVar148,auVar105);
            auVar143._8_4_ = 0xc2b0c0a5;
            auVar143._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar143._12_4_ = 0xc2b0c0a5;
            auVar143._16_4_ = 0xc2b0c0a5;
            auVar143._20_4_ = 0xc2b0c0a5;
            auVar143._24_4_ = 0xc2b0c0a5;
            auVar143._28_4_ = 0xc2b0c0a5;
            auVar92 = vmaxps_avx(auVar78,auVar143);
            auVar117._0_4_ = auVar92._0_4_ * 1.442695 + 0.5;
            auVar117._4_4_ = auVar92._4_4_ * 1.442695 + 0.5;
            auVar117._8_4_ = auVar92._8_4_ * 1.442695 + 0.5;
            auVar117._12_4_ = auVar92._12_4_ * 1.442695 + 0.5;
            auVar117._16_4_ = auVar92._16_4_ * 1.442695 + 0.5;
            auVar117._20_4_ = auVar92._20_4_ * 1.442695 + 0.5;
            auVar117._24_4_ = auVar92._24_4_ * 1.442695 + 0.5;
            auVar117._28_4_ = auVar116._28_4_ + 0.5;
            auVar113 = vroundps_avx(auVar117,1);
            auVar78 = vcmpps_avx(auVar117,auVar113,1);
            auVar78 = vandps_avx(auVar78,auVar144);
            auVar78 = vsubps_avx(auVar113,auVar78);
            auVar18._4_4_ = auVar78._4_4_ * 0.6931472;
            auVar18._0_4_ = auVar78._0_4_ * 0.6931472;
            auVar18._8_4_ = auVar78._8_4_ * 0.6931472;
            auVar18._12_4_ = auVar78._12_4_ * 0.6931472;
            auVar18._16_4_ = auVar78._16_4_ * 0.6931472;
            auVar18._20_4_ = auVar78._20_4_ * 0.6931472;
            auVar18._24_4_ = auVar78._24_4_ * 0.6931472;
            auVar18._28_4_ = auVar113._28_4_;
            auVar92 = vsubps_avx(auVar92,auVar18);
            fVar122 = auVar92._0_4_;
            fVar132 = auVar92._4_4_;
            fVar128 = auVar92._8_4_;
            fVar137 = auVar92._12_4_;
            fVar129 = auVar92._16_4_;
            fVar138 = auVar92._20_4_;
            fVar130 = auVar92._24_4_;
            auVar112._0_4_ = (int)auVar78._0_4_;
            auVar112._4_4_ = (int)auVar78._4_4_;
            auVar112._8_4_ = (int)auVar78._8_4_;
            auVar112._12_4_ = (int)auVar78._12_4_;
            auVar118._16_4_ = (int)auVar78._16_4_;
            auVar118._0_16_ = auVar112;
            auVar118._20_4_ = (int)auVar78._20_4_;
            auVar118._24_4_ = (int)auVar78._24_4_;
            auVar118._28_4_ = (int)auVar78._28_4_;
            auVar100 = vpslld_avx(auVar112,0x17);
            auVar91 = vpslld_avx(auVar118._16_16_,0x17);
            auVar91 = vpaddd_avx(auVar147,auVar91);
            auVar100 = vpaddd_avx(auVar147,auVar100);
            auVar106._0_4_ =
                 (fVar122 + 1.0 +
                 fVar122 * fVar122 *
                 (((((fVar122 * 0.00019875691 + 0.0013981999) * fVar122 + 0.008333452) * fVar122 +
                   0.041665796) * fVar122 + 0.16666666) * fVar122 + 0.5)) * auVar100._0_4_ + 1.0;
            auVar106._4_4_ =
                 (fVar132 + 1.0 +
                 fVar132 * fVar132 *
                 (((((fVar132 * 0.00019875691 + 0.0013981999) * fVar132 + 0.008333452) * fVar132 +
                   0.041665796) * fVar132 + 0.16666666) * fVar132 + 0.5)) * auVar100._4_4_ + 1.0;
            auVar106._8_4_ =
                 (fVar128 + 1.0 +
                 fVar128 * fVar128 *
                 (((((fVar128 * 0.00019875691 + 0.0013981999) * fVar128 + 0.008333452) * fVar128 +
                   0.041665796) * fVar128 + 0.16666666) * fVar128 + 0.5)) * auVar100._8_4_ + 1.0;
            auVar106._12_4_ =
                 (fVar137 + 1.0 +
                 fVar137 * fVar137 *
                 (((((fVar137 * 0.00019875691 + 0.0013981999) * fVar137 + 0.008333452) * fVar137 +
                   0.041665796) * fVar137 + 0.16666666) * fVar137 + 0.5)) * auVar100._12_4_ + 1.0;
            auVar106._16_4_ =
                 (fVar129 + 1.0 +
                 fVar129 * fVar129 *
                 (((((fVar129 * 0.00019875691 + 0.0013981999) * fVar129 + 0.008333452) * fVar129 +
                   0.041665796) * fVar129 + 0.16666666) * fVar129 + 0.5)) * auVar91._0_4_ + 1.0;
            auVar106._20_4_ =
                 (fVar138 + 1.0 +
                 fVar138 * fVar138 *
                 (((((fVar138 * 0.00019875691 + 0.0013981999) * fVar138 + 0.008333452) * fVar138 +
                   0.041665796) * fVar138 + 0.16666666) * fVar138 + 0.5)) * auVar91._4_4_ + 1.0;
            auVar106._24_4_ =
                 (fVar130 + 1.0 +
                 fVar130 * fVar130 *
                 (((((fVar130 * 0.00019875691 + 0.0013981999) * fVar130 + 0.008333452) * fVar130 +
                   0.041665796) * fVar130 + 0.16666666) * fVar130 + 0.5)) * auVar91._8_4_ + 1.0;
            auVar106._28_4_ = auVar92._28_4_ + 1.0 + auVar113._28_4_ + 1.0;
            auVar113 = vrcpps_avx(auVar106);
            auVar78 = *(undefined1 (*) [32])((long)pvVar57 + lVar32);
            fVar132 = auVar78._0_4_ * auVar113._0_4_;
            fVar137 = auVar78._4_4_ * auVar113._4_4_;
            fVar138 = auVar78._8_4_ * auVar113._8_4_;
            fVar139 = auVar78._12_4_ * auVar113._12_4_;
            fVar140 = auVar78._16_4_ * auVar113._16_4_;
            fVar141 = auVar78._20_4_ * auVar113._20_4_;
            fVar142 = auVar78._24_4_ * auVar113._24_4_;
            auVar19._4_4_ = auVar106._4_4_ * fVar137;
            auVar19._0_4_ = auVar106._0_4_ * fVar132;
            auVar19._8_4_ = auVar106._8_4_ * fVar138;
            auVar19._12_4_ = auVar106._12_4_ * fVar139;
            auVar19._16_4_ = auVar106._16_4_ * fVar140;
            auVar19._20_4_ = auVar106._20_4_ * fVar141;
            auVar19._24_4_ = auVar106._24_4_ * fVar142;
            auVar19._28_4_ = auVar106._28_4_;
            auVar145 = vsubps_avx(auVar78,auVar19);
            auVar92 = *(undefined1 (*) [32])((long)pvVar61 + lVar32);
            auVar119._0_8_ = auVar92._0_8_ ^ 0x8000000080000000;
            auVar119._8_4_ = auVar92._8_4_ ^ 0x80000000;
            auVar119._12_4_ = auVar92._12_4_ ^ 0x80000000;
            auVar119._16_4_ = auVar92._16_4_ ^ 0x80000000;
            auVar119._20_4_ = auVar92._20_4_ ^ 0x80000000;
            auVar119._24_4_ = auVar92._24_4_ ^ 0x80000000;
            auVar119._28_4_ = auVar92._28_4_ ^ 0x80000000;
            auVar92 = vminps_avx(auVar148,auVar119);
            auVar92 = vmaxps_avx(auVar92,auVar143);
            auVar125._0_4_ = auVar92._0_4_ * 1.442695 + 0.5;
            auVar125._4_4_ = auVar92._4_4_ * 1.442695 + 0.5;
            auVar125._8_4_ = auVar92._8_4_ * 1.442695 + 0.5;
            auVar125._12_4_ = auVar92._12_4_ * 1.442695 + 0.5;
            auVar125._16_4_ = auVar92._16_4_ * 1.442695 + 0.5;
            auVar125._20_4_ = auVar92._20_4_ * 1.442695 + 0.5;
            auVar125._24_4_ = auVar92._24_4_ * 1.442695 + 0.5;
            auVar125._28_4_ = auVar78._28_4_ + 0.5;
            auVar124 = vroundps_avx(auVar125,1);
            auVar78 = vcmpps_avx(auVar125,auVar124,1);
            auVar78 = vandps_avx(auVar78,auVar144);
            auVar78 = vsubps_avx(auVar124,auVar78);
            auVar20._4_4_ = auVar78._4_4_ * 0.6931472;
            auVar20._0_4_ = auVar78._0_4_ * 0.6931472;
            auVar20._8_4_ = auVar78._8_4_ * 0.6931472;
            auVar20._12_4_ = auVar78._12_4_ * 0.6931472;
            auVar20._16_4_ = auVar78._16_4_ * 0.6931472;
            auVar20._20_4_ = auVar78._20_4_ * 0.6931472;
            auVar20._24_4_ = auVar78._24_4_ * 0.6931472;
            auVar20._28_4_ = auVar124._28_4_;
            auVar79 = vsubps_avx(auVar92,auVar20);
            fVar122 = auVar79._0_4_;
            fVar128 = auVar79._4_4_;
            fVar129 = auVar79._8_4_;
            fVar130 = auVar79._12_4_;
            fVar149 = auVar79._16_4_;
            fVar11 = auVar79._20_4_;
            fVar12 = auVar79._24_4_;
            auVar123._0_4_ = (int)auVar78._0_4_;
            auVar123._4_4_ = (int)auVar78._4_4_;
            auVar123._8_4_ = (int)auVar78._8_4_;
            auVar123._12_4_ = (int)auVar78._12_4_;
            auVar126._16_4_ = (int)auVar78._16_4_;
            auVar126._0_16_ = auVar123;
            auVar126._20_4_ = (int)auVar78._20_4_;
            auVar126._24_4_ = (int)auVar78._24_4_;
            auVar126._28_4_ = (int)auVar78._28_4_;
            auVar100 = vpslld_avx(auVar123,0x17);
            auVar91 = vpslld_avx(auVar126._16_16_,0x17);
            auVar91 = vpaddd_avx(auVar147,auVar91);
            auVar100 = vpaddd_avx(auVar147,auVar100);
            auVar83._0_4_ =
                 fVar132 + auVar113._0_4_ * auVar145._0_4_ + fVar77 +
                 auVar102._0_4_ * auVar133._0_4_;
            auVar83._4_4_ =
                 fVar137 + auVar113._4_4_ * auVar145._4_4_ + fVar85 +
                 auVar102._4_4_ * auVar133._4_4_;
            auVar83._8_4_ =
                 fVar138 + auVar113._8_4_ * auVar145._8_4_ + fVar86 +
                 auVar102._8_4_ * auVar133._8_4_;
            auVar83._12_4_ =
                 fVar139 + auVar113._12_4_ * auVar145._12_4_ + fVar87 +
                 auVar102._12_4_ * auVar133._12_4_;
            auVar83._16_4_ =
                 fVar140 + auVar113._16_4_ * auVar145._16_4_ + fVar88 +
                 auVar102._16_4_ * auVar133._16_4_;
            auVar83._20_4_ =
                 fVar141 + auVar113._20_4_ * auVar145._20_4_ + fVar89 +
                 auVar102._20_4_ * auVar133._20_4_;
            auVar83._24_4_ =
                 fVar142 + auVar113._24_4_ * auVar145._24_4_ + fVar90 +
                 auVar102._24_4_ * auVar133._24_4_;
            auVar83._28_4_ = auVar145._28_4_ + 2.718064 + fVar131 + fVar131;
            auVar21._4_4_ = auVar83._4_4_ * -2.0;
            auVar21._0_4_ = auVar83._0_4_ * -2.0;
            auVar21._8_4_ = auVar83._8_4_ * -2.0;
            auVar21._12_4_ = auVar83._12_4_ * -2.0;
            auVar21._16_4_ = auVar83._16_4_ * -2.0;
            auVar21._20_4_ = auVar83._20_4_ * -2.0;
            auVar21._24_4_ = auVar83._24_4_ * -2.0;
            auVar21._28_4_ = 0xc0000000;
            auVar78 = vminps_avx(auVar148,auVar21);
            auVar107._8_4_ = 0xc2b0c0a5;
            auVar107._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar107._12_4_ = 0xc2b0c0a5;
            auVar107._16_4_ = 0xc2b0c0a5;
            auVar107._20_4_ = 0xc2b0c0a5;
            auVar107._24_4_ = 0xc2b0c0a5;
            auVar107._28_4_ = 0xc2b0c0a5;
            auVar92 = vmaxps_avx(auVar78,auVar107);
            auVar108._0_4_ = auVar92._0_4_ * 1.442695 + 0.5;
            auVar108._4_4_ = auVar92._4_4_ * 1.442695 + 0.5;
            auVar108._8_4_ = auVar92._8_4_ * 1.442695 + 0.5;
            auVar108._12_4_ = auVar92._12_4_ * 1.442695 + 0.5;
            auVar108._16_4_ = auVar92._16_4_ * 1.442695 + 0.5;
            auVar108._20_4_ = auVar92._20_4_ * 1.442695 + 0.5;
            auVar108._24_4_ = auVar92._24_4_ * 1.442695 + 0.5;
            auVar108._28_4_ = 0xc2afc0a5;
            auVar102 = vroundps_avx(auVar108,1);
            auVar78 = vcmpps_avx(auVar108,auVar102,1);
            auVar78 = vandps_avx(auVar78,auVar144);
            auVar78 = vsubps_avx(auVar102,auVar78);
            auVar22._4_4_ = auVar78._4_4_ * 0.6931472;
            auVar22._0_4_ = auVar78._0_4_ * 0.6931472;
            auVar22._8_4_ = auVar78._8_4_ * 0.6931472;
            auVar22._12_4_ = auVar78._12_4_ * 0.6931472;
            auVar22._16_4_ = auVar78._16_4_ * 0.6931472;
            auVar22._20_4_ = auVar78._20_4_ * 0.6931472;
            auVar22._24_4_ = auVar78._24_4_ * 0.6931472;
            auVar22._28_4_ = auVar102._28_4_;
            auVar92 = vsubps_avx(auVar92,auVar22);
            fVar132 = auVar92._0_4_;
            fVar137 = auVar92._4_4_;
            fVar138 = auVar92._8_4_;
            fVar131 = auVar92._12_4_;
            fVar77 = auVar92._16_4_;
            fVar85 = auVar92._20_4_;
            fVar86 = auVar92._24_4_;
            in_ZMM6 = ZEXT3264(CONCAT428(0x3e2aaaaa,
                                         CONCAT424(0x3e2aaaaa,
                                                   CONCAT420(0x3e2aaaaa,
                                                             CONCAT416(0x3e2aaaaa,
                                                                       CONCAT412(0x3e2aaaaa,
                                                                                 CONCAT48(0x3e2aaaaa
                                                                                          ,
                                                  0x3e2aaaaa3e2aaaaa)))))));
            auVar120._0_4_ =
                 (fVar122 + 1.0 +
                 fVar122 * fVar122 *
                 (((((fVar122 * 0.00019875691 + 0.0013981999) * fVar122 + 0.008333452) * fVar122 +
                   0.041665796) * fVar122 + 0.16666666) * fVar122 + 0.5)) * auVar100._0_4_ + 1.0;
            auVar120._4_4_ =
                 (fVar128 + 1.0 +
                 fVar128 * fVar128 *
                 (((((fVar128 * 0.00019875691 + 0.0013981999) * fVar128 + 0.008333452) * fVar128 +
                   0.041665796) * fVar128 + 0.16666666) * fVar128 + 0.5)) * auVar100._4_4_ + 1.0;
            auVar120._8_4_ =
                 (fVar129 + 1.0 +
                 fVar129 * fVar129 *
                 (((((fVar129 * 0.00019875691 + 0.0013981999) * fVar129 + 0.008333452) * fVar129 +
                   0.041665796) * fVar129 + 0.16666666) * fVar129 + 0.5)) * auVar100._8_4_ + 1.0;
            auVar120._12_4_ =
                 (fVar130 + 1.0 +
                 fVar130 * fVar130 *
                 (((((fVar130 * 0.00019875691 + 0.0013981999) * fVar130 + 0.008333452) * fVar130 +
                   0.041665796) * fVar130 + 0.16666666) * fVar130 + 0.5)) * auVar100._12_4_ + 1.0;
            auVar120._16_4_ =
                 (fVar149 + 1.0 +
                 fVar149 * fVar149 *
                 (((((fVar149 * 0.00019875691 + 0.0013981999) * fVar149 + 0.008333452) * fVar149 +
                   0.041665796) * fVar149 + 0.16666666) * fVar149 + 0.5)) * auVar91._0_4_ + 1.0;
            auVar120._20_4_ =
                 (fVar11 + 1.0 +
                 fVar11 * fVar11 *
                 (((((fVar11 * 0.00019875691 + 0.0013981999) * fVar11 + 0.008333452) * fVar11 +
                   0.041665796) * fVar11 + 0.16666666) * fVar11 + 0.5)) * auVar91._4_4_ + 1.0;
            auVar120._24_4_ =
                 (fVar12 + 1.0 +
                 fVar12 * fVar12 *
                 (((((fVar12 * 0.00019875691 + 0.0013981999) * fVar12 + 0.008333452) * fVar12 +
                   0.041665796) * fVar12 + 0.16666666) * fVar12 + 0.5)) * auVar91._8_4_ + 1.0;
            auVar120._28_4_ = auVar79._28_4_ + 1.0 + auVar124._28_4_ + 1.0;
            auVar101._0_4_ = (int)auVar78._0_4_;
            auVar101._4_4_ = (int)auVar78._4_4_;
            auVar101._8_4_ = (int)auVar78._8_4_;
            auVar101._12_4_ = (int)auVar78._12_4_;
            auVar109._16_4_ = (int)auVar78._16_4_;
            auVar109._0_16_ = auVar101;
            auVar109._20_4_ = (int)auVar78._20_4_;
            auVar109._24_4_ = (int)auVar78._24_4_;
            auVar109._28_4_ = (int)auVar78._28_4_;
            auVar100 = vpslld_avx(auVar101,0x17);
            auVar91 = vpslld_avx(auVar109._16_16_,0x17);
            auVar91 = vpaddd_avx(auVar147,auVar91);
            auVar100 = vpaddd_avx(auVar147,auVar100);
            auVar97._0_4_ =
                 (fVar132 + 1.0 +
                 fVar132 * fVar132 *
                 (((((fVar132 * 0.00019875691 + 0.0013981999) * fVar132 + 0.008333452) * fVar132 +
                   0.041665796) * fVar132 + 0.16666666) * fVar132 + 0.5)) * auVar100._0_4_ + 1.0;
            auVar97._4_4_ =
                 (fVar137 + 1.0 +
                 fVar137 * fVar137 *
                 (((((fVar137 * 0.00019875691 + 0.0013981999) * fVar137 + 0.008333452) * fVar137 +
                   0.041665796) * fVar137 + 0.16666666) * fVar137 + 0.5)) * auVar100._4_4_ + 1.0;
            auVar97._8_4_ =
                 (fVar138 + 1.0 +
                 fVar138 * fVar138 *
                 (((((fVar138 * 0.00019875691 + 0.0013981999) * fVar138 + 0.008333452) * fVar138 +
                   0.041665796) * fVar138 + 0.16666666) * fVar138 + 0.5)) * auVar100._8_4_ + 1.0;
            auVar97._12_4_ =
                 (fVar131 + 1.0 +
                 fVar131 * fVar131 *
                 (((((fVar131 * 0.00019875691 + 0.0013981999) * fVar131 + 0.008333452) * fVar131 +
                   0.041665796) * fVar131 + 0.16666666) * fVar131 + 0.5)) * auVar100._12_4_ + 1.0;
            auVar97._16_4_ =
                 (fVar77 + 1.0 +
                 fVar77 * fVar77 *
                 (((((fVar77 * 0.00019875691 + 0.0013981999) * fVar77 + 0.008333452) * fVar77 +
                   0.041665796) * fVar77 + 0.16666666) * fVar77 + 0.5)) * auVar91._0_4_ + 1.0;
            auVar97._20_4_ =
                 (fVar85 + 1.0 +
                 fVar85 * fVar85 *
                 (((((fVar85 * 0.00019875691 + 0.0013981999) * fVar85 + 0.008333452) * fVar85 +
                   0.041665796) * fVar85 + 0.16666666) * fVar85 + 0.5)) * auVar91._4_4_ + 1.0;
            auVar97._24_4_ =
                 (fVar86 + 1.0 +
                 fVar86 * fVar86 *
                 (((((fVar86 * 0.00019875691 + 0.0013981999) * fVar86 + 0.008333452) * fVar86 +
                   0.041665796) * fVar86 + 0.16666666) * fVar86 + 0.5)) * auVar91._8_4_ + 1.0;
            auVar97._28_4_ = auVar92._28_4_ + 1.0 + auVar102._28_4_ + 1.0;
            auVar78 = vrcpps_avx(auVar97);
            fVar122 = auVar78._0_4_;
            fVar132 = auVar78._4_4_;
            fVar128 = auVar78._8_4_;
            fVar137 = auVar78._12_4_;
            fVar129 = auVar78._16_4_;
            fVar138 = auVar78._20_4_;
            fVar130 = auVar78._24_4_;
            auVar23._4_4_ = auVar97._4_4_ * (fVar132 + fVar132);
            auVar23._0_4_ = auVar97._0_4_ * (fVar122 + fVar122);
            auVar23._8_4_ = auVar97._8_4_ * (fVar128 + fVar128);
            auVar23._12_4_ = auVar97._12_4_ * (fVar137 + fVar137);
            auVar23._16_4_ = auVar97._16_4_ * (fVar129 + fVar129);
            auVar23._20_4_ = auVar97._20_4_ * (fVar138 + fVar138);
            auVar23._24_4_ = auVar97._24_4_ * (fVar130 + fVar130);
            auVar23._28_4_ = auVar97._28_4_;
            auVar135._8_4_ = 0x40000000;
            auVar135._0_8_ = 0x4000000040000000;
            auVar135._12_4_ = 0x40000000;
            auVar135._16_4_ = 0x40000000;
            auVar135._20_4_ = 0x40000000;
            auVar135._24_4_ = 0x40000000;
            auVar135._28_4_ = 0x40000000;
            auVar102 = vsubps_avx(auVar135,auVar23);
            auVar92 = vrcpps_avx(auVar120);
            in_ZMM5 = ZEXT3264(CONCAT428(0xbf800000,
                                         CONCAT424(0xbf800000,
                                                   CONCAT420(0xbf800000,
                                                             CONCAT416(0xbf800000,
                                                                       CONCAT412(0xbf800000,
                                                                                 CONCAT48(0xbf800000
                                                                                          ,
                                                  0xbf800000bf800000)))))));
            fVar131 = auVar78._28_4_ + auVar78._28_4_ + -1.0;
            auVar98._0_4_ = fVar122 + fVar122 + -1.0 + fVar122 * auVar102._0_4_;
            auVar98._4_4_ = fVar132 + fVar132 + -1.0 + fVar132 * auVar102._4_4_;
            auVar98._8_4_ = fVar128 + fVar128 + -1.0 + fVar128 * auVar102._8_4_;
            auVar98._12_4_ = fVar137 + fVar137 + -1.0 + fVar137 * auVar102._12_4_;
            auVar98._16_4_ = fVar129 + fVar129 + -1.0 + fVar129 * auVar102._16_4_;
            auVar98._20_4_ = fVar138 + fVar138 + -1.0 + fVar138 * auVar102._20_4_;
            auVar98._24_4_ = fVar130 + fVar130 + -1.0 + fVar130 * auVar102._24_4_;
            auVar98._28_4_ = fVar131 + auVar102._28_4_;
            fVar122 = auVar98._0_4_ * auVar92._0_4_;
            fVar132 = auVar98._4_4_ * auVar92._4_4_;
            fVar128 = auVar98._8_4_ * auVar92._8_4_;
            fVar137 = auVar98._12_4_ * auVar92._12_4_;
            fVar129 = auVar98._16_4_ * auVar92._16_4_;
            fVar138 = auVar98._20_4_ * auVar92._20_4_;
            fVar130 = auVar98._24_4_ * auVar92._24_4_;
            auVar24._4_4_ = auVar120._4_4_ * fVar132;
            auVar24._0_4_ = auVar120._0_4_ * fVar122;
            auVar24._8_4_ = auVar120._8_4_ * fVar128;
            auVar24._12_4_ = auVar120._12_4_ * fVar137;
            auVar24._16_4_ = auVar120._16_4_ * fVar129;
            auVar24._20_4_ = auVar120._20_4_ * fVar138;
            auVar24._24_4_ = auVar120._24_4_ * fVar130;
            auVar24._28_4_ = auVar120._28_4_;
            in_ZMM3 = ZEXT3264(auVar24);
            auVar78 = vsubps_avx(auVar98,auVar24);
            fVar122 = fVar122 + auVar92._0_4_ * auVar78._0_4_;
            fVar132 = fVar132 + auVar92._4_4_ * auVar78._4_4_;
            fVar128 = fVar128 + auVar92._8_4_ * auVar78._8_4_;
            fVar137 = fVar137 + auVar92._12_4_ * auVar78._12_4_;
            fVar129 = fVar129 + auVar92._16_4_ * auVar78._16_4_;
            fVar138 = fVar138 + auVar92._20_4_ * auVar78._20_4_;
            fVar130 = fVar130 + auVar92._24_4_ * auVar78._24_4_;
            fVar131 = fVar131 + auVar78._28_4_;
            *(undefined1 (*) [32])((long)pvVar57 + lVar32) = auVar83;
            pfVar3 = (float *)((long)pvVar68 + lVar32);
            *pfVar3 = fVar122;
            pfVar3[1] = fVar132;
            pfVar3[2] = fVar128;
            pfVar3[3] = fVar137;
            pfVar3[4] = fVar129;
            pfVar3[5] = fVar138;
            pfVar3[6] = fVar130;
            pfVar3[7] = fVar131;
            pfVar3 = (float *)((long)pvVar44 + lVar32);
            *pfVar3 = fVar122;
            pfVar3[1] = fVar132;
            pfVar3[2] = fVar128;
            pfVar3[3] = fVar137;
            pfVar3[4] = fVar129;
            pfVar3[5] = fVar138;
            pfVar3[6] = fVar130;
            pfVar3[7] = fVar131;
            iVar27 = iVar27 + -1;
            lVar29 = lVar32 + 0x20;
          } while (1 < iVar27);
          pvVar51 = (void *)((long)pvVar51 + lVar29);
          pvVar61 = (void *)((long)pvVar61 + lVar29);
          ppp_Var41 = (_func_int ***)((long)(ppp_Var41 + 4) + lVar32);
          pAVar55 = (Allocator *)
                    ((long)&((Allocator *)((long)local_78.data + 0x20))->_vptr_Allocator + lVar32);
          pvVar68 = (void *)((long)pvVar68 + lVar29);
          pvVar57 = (void *)((long)pvVar57 + lVar29);
          pvVar44 = (void *)((long)pvVar44 + lVar29);
        }
        if ((uVar56 & 7) != 0) {
          lVar29 = 0;
          iVar27 = iVar39;
          do {
            fVar122 = *(float *)((long)pvVar51 + lVar29);
            in_ZMM3 = ZEXT1664(in_ZMM3._0_16_);
            in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
            in_ZMM6 = ZEXT1664(in_ZMM6._0_16_);
            in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
            in_ZMM10 = ZEXT1664(in_ZMM10._0_16_);
            fVar132 = expf(-*(float *)((long)&pAVar55->_vptr_Allocator + lVar29));
            fVar128 = expf(-*(float *)((long)ppp_Var41 + lVar29));
            fVar137 = expf(-*(float *)((long)pvVar61 + lVar29));
            fVar122 = tanhf(fVar122);
            fVar122 = *(float *)((long)pvVar57 + lVar29) / (fVar128 + 1.0) +
                      fVar122 / (fVar132 + 1.0);
            fVar132 = tanhf(fVar122);
            fVar132 = fVar132 / (fVar137 + 1.0);
            *(float *)((long)pvVar57 + lVar29) = fVar122;
            *(float *)((long)pvVar68 + lVar29) = fVar132;
            *(float *)((long)pvVar44 + lVar29) = fVar132;
            iVar27 = iVar27 + -1;
            lVar29 = lVar29 + 4;
          } while (1 < iVar27);
        }
        uVar34 = uVar34 + 1;
      } while (uVar34 != uVar9);
    }
    iVar38 = 0;
  }
  piVar25 = (int *)CONCAT44(local_78.refcount._4_4_,(int)local_78.refcount);
  if (piVar25 != (int *)0x0) {
    LOCK();
    *piVar25 = *piVar25 + -1;
    UNLOCK();
    if (*piVar25 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_78.data != (Allocator *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar38;
}

Assistant:

static int lstm(const Mat& bottom_blob, Mat& top_blob, int reverse, const Mat& weight_xc, const Mat& bias_c, const Mat& weight_hc, Mat& hidden_state, Mat& cell_state, const Option& opt)
{
    int size = bottom_blob.w;
    int T = bottom_blob.h;

    int num_output = top_blob.w;

    // 4 x num_output
    Mat gates(num_output, 4, 4u, opt.workspace_allocator);
    if (gates.empty())
        return -100;

    // unroll
    for (int t = 0; t < T; t++)
    {
        // clip hidden by continuation indicator
        // h_cont_{t-1} = cont_t * h_{t-1}
        // h_cont_{t-1} = h_{t-1} if cont_t == 1
        //                0       otherwise
        // calculate hidden
        // gate_input_t := W_hc * h_conted_{t-1} + W_xc * x_t + b_c

        int ti = reverse ? T - 1 - t : t;

        int nn_num_output = num_output >> 1;
        int remain_num_output_start = nn_num_output << 1;
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int qq = 0; qq < nn_num_output; qq++)
        {
            int q = qq * 2;

            const float* x = bottom_blob.row(ti);
            const float* hidden_ptr_r = hidden_state;
            const float* bias_c_I = bias_c.row(0);
            const float* bias_c_F = bias_c.row(1);
            const float* bias_c_O = bias_c.row(2);
            const float* bias_c_G = bias_c.row(3);

            float* gates_data_I = gates.row(0);
            float* gates_data_F = gates.row(1);
            float* gates_data_O = gates.row(2);
            float* gates_data_G = gates.row(3);
            // gate I F O G
            const float* weight_xc_I_0 = weight_xc.row(num_output * 0 + q);
            const float* weight_xc_F_0 = weight_xc.row(num_output * 1 + q);
            const float* weight_xc_O_0 = weight_xc.row(num_output * 2 + q);
            const float* weight_xc_G_0 = weight_xc.row(num_output * 3 + q);
            const float* weight_xc_I_1 = weight_xc.row(num_output * 0 + (q + 1));
            const float* weight_xc_F_1 = weight_xc.row(num_output * 1 + (q + 1));
            const float* weight_xc_O_1 = weight_xc.row(num_output * 2 + (q + 1));
            const float* weight_xc_G_1 = weight_xc.row(num_output * 3 + (q + 1));

            const float* weight_hc_I_0 = weight_hc.row(num_output * 0 + q);
            const float* weight_hc_F_0 = weight_hc.row(num_output * 1 + q);
            const float* weight_hc_O_0 = weight_hc.row(num_output * 2 + q);
            const float* weight_hc_G_0 = weight_hc.row(num_output * 3 + q);
            const float* weight_hc_I_1 = weight_hc.row(num_output * 0 + (q + 1));
            const float* weight_hc_F_1 = weight_hc.row(num_output * 1 + (q + 1));
            const float* weight_hc_O_1 = weight_hc.row(num_output * 2 + (q + 1));
            const float* weight_hc_G_1 = weight_hc.row(num_output * 3 + (q + 1));

            // float I = bias_c_I[q];
            // float F = bias_c_F[q];
            // float O = bias_c_O[q];
            // float G = bias_c_G[q];
            __m256 _sumI_0 = _mm256_setzero_ps();
            __m256 _sumF_0 = _mm256_setzero_ps();
            __m256 _sumO_0 = _mm256_setzero_ps();
            __m256 _sumG_0 = _mm256_setzero_ps();
            __m256 _sumI_1 = _mm256_setzero_ps();
            __m256 _sumF_1 = _mm256_setzero_ps();
            __m256 _sumO_1 = _mm256_setzero_ps();
            __m256 _sumG_1 = _mm256_setzero_ps();
            int nn_num_size = size >> 3;
            int remain_size = size & 7;
            for (; nn_num_size > 0; nn_num_size--)
            {
                __m256 xi = _mm256_loadu_ps(x);
                _sumI_0 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_xc_I_0), xi, _sumI_0);
                _sumF_0 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_xc_F_0), xi, _sumF_0);
                _sumO_0 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_xc_O_0), xi, _sumO_0);
                _sumG_0 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_xc_G_0), xi, _sumG_0);
                _sumI_1 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_xc_I_1), xi, _sumI_1);
                _sumF_1 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_xc_F_1), xi, _sumF_1);
                _sumO_1 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_xc_O_1), xi, _sumO_1);
                _sumG_1 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_xc_G_1), xi, _sumG_1);
                x += 8;
                weight_xc_I_0 += 8;
                weight_xc_F_0 += 8;
                weight_xc_O_0 += 8;
                weight_xc_G_0 += 8;
                weight_xc_I_1 += 8;
                weight_xc_F_1 += 8;
                weight_xc_O_1 += 8;
                weight_xc_G_1 += 8;
            }
            int nn_num_output = num_output >> 3;
            int remain_num_output = num_output & 7;
            for (; nn_num_output > 0; nn_num_output--)
            {
                __m256 h_cont = _mm256_loadu_ps(hidden_ptr_r);

                _sumI_0 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_hc_I_0), h_cont, _sumI_0);
                _sumF_0 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_hc_F_0), h_cont, _sumF_0);
                _sumO_0 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_hc_O_0), h_cont, _sumO_0);
                _sumG_0 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_hc_G_0), h_cont, _sumG_0);
                _sumI_1 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_hc_I_1), h_cont, _sumI_1);
                _sumF_1 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_hc_F_1), h_cont, _sumF_1);
                _sumO_1 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_hc_O_1), h_cont, _sumO_1);
                _sumG_1 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_hc_G_1), h_cont, _sumG_1);
                hidden_ptr_r += 8;
                weight_hc_I_0 += 8;
                weight_hc_F_0 += 8;
                weight_hc_O_0 += 8;
                weight_hc_G_0 += 8;
                weight_hc_I_1 += 8;
                weight_hc_F_1 += 8;
                weight_hc_O_1 += 8;
                weight_hc_G_1 += 8;
            }
            float sums[8];
            _mm256_storeu_ps(sums, HorizontalSums(_sumI_0, _sumF_0, _sumO_0, _sumG_0, _sumI_1, _sumF_1, _sumO_1, _sumG_1));
            sums[0] += bias_c_I[q];
            sums[1] += bias_c_F[q];
            sums[2] += bias_c_O[q];
            sums[3] += bias_c_G[q];
            sums[4] += bias_c_I[q + 1];
            sums[5] += bias_c_F[q + 1];
            sums[6] += bias_c_O[q + 1];
            sums[7] += bias_c_G[q + 1];

            for (; remain_size > 0; remain_size--)
            {
                float xi = *x;
                sums[0] += *weight_xc_I_0 * xi;
                sums[1] += *weight_xc_F_0 * xi;
                sums[2] += *weight_xc_O_0 * xi;
                sums[3] += *weight_xc_G_0 * xi;
                sums[4] += *weight_xc_I_1 * xi;
                sums[5] += *weight_xc_F_1 * xi;
                sums[6] += *weight_xc_O_1 * xi;
                sums[7] += *weight_xc_G_1 * xi;
                x++;
                weight_xc_I_0++;
                weight_xc_F_0++;
                weight_xc_O_0++;
                weight_xc_G_0++;
                weight_xc_I_1++;
                weight_xc_F_1++;
                weight_xc_O_1++;
                weight_xc_G_1++;
            }

            for (; remain_num_output > 0; remain_num_output--)
            {
                float h_cont = *hidden_ptr_r;
                sums[0] += *weight_hc_I_0 * h_cont;
                sums[1] += *weight_hc_F_0 * h_cont;
                sums[2] += *weight_hc_O_0 * h_cont;
                sums[3] += *weight_hc_G_0 * h_cont;
                sums[4] += *weight_hc_I_1 * h_cont;
                sums[5] += *weight_hc_F_1 * h_cont;
                sums[6] += *weight_hc_O_1 * h_cont;
                sums[7] += *weight_hc_G_1 * h_cont;
                hidden_ptr_r++;
                weight_hc_I_0++;
                weight_hc_F_0++;
                weight_hc_O_0++;
                weight_hc_G_0++;
                weight_hc_I_1++;
                weight_hc_F_1++;
                weight_hc_O_1++;
                weight_hc_G_1++;
            }
            gates_data_I[q] = sums[0];
            gates_data_F[q] = sums[1];
            gates_data_O[q] = sums[2];
            gates_data_G[q] = sums[3];
            gates_data_I[q + 1] = sums[4];
            gates_data_F[q + 1] = sums[5];
            gates_data_O[q + 1] = sums[6];
            gates_data_G[q + 1] = sums[7];
        }
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = remain_num_output_start; q < num_output; q++)
        {
            const float* x = bottom_blob.row(ti);
            const float* hidden_ptr_r = hidden_state;
            const float* bias_c_I = bias_c.row(0);
            const float* bias_c_F = bias_c.row(1);
            const float* bias_c_O = bias_c.row(2);
            const float* bias_c_G = bias_c.row(3);

            float* gates_data_I = gates.row(0);
            float* gates_data_F = gates.row(1);
            float* gates_data_O = gates.row(2);
            float* gates_data_G = gates.row(3);
            // gate I F O G
            const float* weight_xc_I = weight_xc.row(num_output * 0 + q);
            const float* weight_xc_F = weight_xc.row(num_output * 1 + q);
            const float* weight_xc_O = weight_xc.row(num_output * 2 + q);
            const float* weight_xc_G = weight_xc.row(num_output * 3 + q);

            const float* weight_hc_I = weight_hc.row(num_output * 0 + q);
            const float* weight_hc_F = weight_hc.row(num_output * 1 + q);
            const float* weight_hc_O = weight_hc.row(num_output * 2 + q);
            const float* weight_hc_G = weight_hc.row(num_output * 3 + q);

            // float I = bias_c_I[q];
            // float F = bias_c_F[q];
            // float O = bias_c_O[q];
            // float G = bias_c_G[q];
            __m256 _sumI = _mm256_setzero_ps();
            __m256 _sumF = _mm256_setzero_ps();
            __m256 _sumO = _mm256_setzero_ps();
            __m256 _sumG = _mm256_setzero_ps();
            int nn_num_size = size >> 3;
            int remain_size = size & 7;
            for (; nn_num_size > 0; nn_num_size--)
            {
                __m256 xi = _mm256_loadu_ps(x);
                _sumI = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_xc_I), xi, _sumI);
                _sumF = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_xc_F), xi, _sumF);
                _sumO = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_xc_O), xi, _sumO);
                _sumG = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_xc_G), xi, _sumG);
                x += 8;
                weight_xc_I += 8;
                weight_xc_F += 8;
                weight_xc_O += 8;
                weight_xc_G += 8;
            }
            int nn_num_output = num_output >> 3;
            int remain_num_output = num_output & 7;
            for (; nn_num_output > 0; nn_num_output--)
            {
                __m256 h_cont = _mm256_loadu_ps(hidden_ptr_r);

                _sumI = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_hc_I), h_cont, _sumI);
                _sumF = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_hc_F), h_cont, _sumF);
                _sumO = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_hc_O), h_cont, _sumO);
                _sumG = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_hc_G), h_cont, _sumG);
                hidden_ptr_r += 8;
                weight_hc_I += 8;
                weight_hc_F += 8;
                weight_hc_O += 8;
                weight_hc_G += 8;
            }
            float sums[4];
            _mm_storeu_ps(sums, HorizontalSums(_sumI, _sumF, _sumO, _sumG));
            sums[0] += bias_c_I[q];
            sums[1] += bias_c_F[q];
            sums[2] += bias_c_O[q];
            sums[3] += bias_c_G[q];

            for (; remain_size > 0; remain_size--)
            {
                float xi = *x;
                sums[0] += *weight_xc_I * xi;
                sums[1] += *weight_xc_F * xi;
                sums[2] += *weight_xc_O * xi;
                sums[3] += *weight_xc_G * xi;
                x++;
                weight_xc_I++;
                weight_xc_F++;
                weight_xc_O++;
                weight_xc_G++;
            }

            for (; remain_num_output > 0; remain_num_output--)
            {
                float h_cont = *hidden_ptr_r;
                sums[0] += *weight_hc_I * h_cont;
                sums[1] += *weight_hc_F * h_cont;
                sums[2] += *weight_hc_O * h_cont;
                sums[3] += *weight_hc_G * h_cont;
                hidden_ptr_r++;
                weight_hc_I++;
                weight_hc_F++;
                weight_hc_O++;
                weight_hc_G++;
            }
            gates_data_I[q] = sums[0];
            gates_data_F[q] = sums[1];
            gates_data_O[q] = sums[2];
            gates_data_G[q] = sums[3];
        }

        // lstm unit
        // sigmoid(I)
        // sigmoid(F)
        // sigmoid(O)
        // tanh(G)
        // c_t := f_t .* c_{t-1} + i_t .* g_t
        // h_t := o_t .* tanh[c_t]
        float* output_data = top_blob.row(ti);
        float* cell_ptr = cell_state;
        float* hidden_ptr = hidden_state;
        const float* gates_data_I = gates.row(0);
        const float* gates_data_F = gates.row(1);
        const float* gates_data_O = gates.row(2);
        const float* gates_data_G = gates.row(3);
        int nn_activation = num_output >> 3;
        int remain_activations = num_output & 7;
        for (; nn_activation > 0; nn_activation--)
        {
            __m256 I = sigmoid_avx(_mm256_loadu_ps(gates_data_I));
            __m256 F = sigmoid_avx(_mm256_loadu_ps(gates_data_F));
            __m256 O = sigmoid_avx(_mm256_loadu_ps(gates_data_O));
            __m256 G = tanh_avx(_mm256_loadu_ps(gates_data_G));
            __m256 cell2 = _mm256_add_ps(_mm256_mul_ps(F, _mm256_loadu_ps(cell_ptr)), _mm256_mul_ps(I, G));
            __m256 H = _mm256_mul_ps(O, tanh_avx(cell2));
            _mm256_storeu_ps(cell_ptr, cell2);
            _mm256_storeu_ps(hidden_ptr, H);
            _mm256_storeu_ps(output_data, H);
            cell_ptr += 8;
            output_data += 8;
            hidden_ptr += 8;
            gates_data_I += 8;
            gates_data_F += 8;
            gates_data_O += 8;
            gates_data_G += 8;
        }
        for (; remain_activations > 0; remain_activations--)
        {
            float I = *gates_data_I;
            float F = *gates_data_F;
            float O = *gates_data_O;
            float G = *gates_data_G;

            I = 1.f / (1.f + exp(-I));
            F = 1.f / (1.f + exp(-F));
            O = 1.f / (1.f + exp(-O));
            G = tanh(G);
            float cell2 = F * *cell_ptr + I * G;
            float H = O * tanh(cell2);
            *cell_ptr = cell2;
            *hidden_ptr = H;
            *output_data = H;
            cell_ptr++;
            output_data++;
            hidden_ptr++;
            gates_data_I++;
            gates_data_F++;
            gates_data_O++;
            gates_data_G++;
        }

        // no cell output here
    }

    return 0;
}